

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  BVH *bvh;
  ulong uVar2;
  Geometry *pGVar3;
  RTCRayQueryContext *pRVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  size_t k;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  RayK<8> *pRVar30;
  byte bVar31;
  byte bVar32;
  int iVar33;
  byte bVar34;
  undefined1 (*pauVar35) [32];
  byte bVar36;
  ulong uVar37;
  undefined4 uVar38;
  long lVar39;
  ulong uVar40;
  NodeRef root;
  ulong uVar41;
  ulong *puVar42;
  bool bVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar91 [64];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar93 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2af9;
  long local_2af8;
  RayK<8> *local_2af0;
  RayK<8> *local_2ae8;
  undefined1 (*local_2ae0) [32];
  ulong local_2ad8;
  RTCFilterFunctionNArguments local_2ad0;
  undefined1 local_2aa0 [32];
  undefined1 local_2a80 [32];
  ulong local_2a48;
  ulong local_2a40;
  long local_2a38;
  undefined8 local_2a30;
  undefined8 uStack_2a28;
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  RTCHitN local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  uint local_2900;
  uint uStack_28fc;
  uint uStack_28f8;
  uint uStack_28f4;
  uint uStack_28f0;
  uint uStack_28ec;
  uint uStack_28e8;
  uint uStack_28e4;
  uint local_28e0;
  uint uStack_28dc;
  uint uStack_28d8;
  uint uStack_28d4;
  uint uStack_28d0;
  uint uStack_28cc;
  uint uStack_28c8;
  uint uStack_28c4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_28c0;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  int local_27a0;
  int iStack_279c;
  int iStack_2798;
  int iStack_2794;
  int iStack_2790;
  int iStack_278c;
  int iStack_2788;
  int iStack_2784;
  uint local_2780;
  uint uStack_277c;
  uint uStack_2778;
  uint uStack_2774;
  uint uStack_2770;
  uint uStack_276c;
  uint uStack_2768;
  uint uStack_2764;
  uint local_2760;
  uint uStack_275c;
  uint uStack_2758;
  uint uStack_2754;
  uint uStack_2750;
  uint uStack_274c;
  uint uStack_2748;
  uint uStack_2744;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 uStack_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  undefined4 uStack_2684;
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 uStack_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar46 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar80 = ZEXT816(0) << 0x40;
      uVar44 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar80),5);
      uVar41 = vpcmpeqd_avx512vl(auVar46,(undefined1  [32])valid_i->field_0);
      uVar44 = uVar44 & uVar41;
      bVar32 = (byte)uVar44;
      if (bVar32 != 0) {
        local_28c0._0_8_ = *(undefined8 *)ray;
        local_28c0._8_8_ = *(undefined8 *)(ray + 8);
        local_28c0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_28c0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_28c0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_28c0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_28c0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_28c0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_28c0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_28c0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_28c0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_28c0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2860 = *(undefined1 (*) [32])(ray + 0x80);
        local_2840 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2820 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar103 = ZEXT3264(auVar46);
        vandps_avx512vl(local_2860,auVar46);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        auVar104 = ZEXT3264(auVar47);
        uVar41 = vcmpps_avx512vl(auVar46,auVar47,1);
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar105 = ZEXT3264(auVar48);
        auVar49 = vdivps_avx512vl(auVar48,local_2860);
        vandps_avx512vl(local_2840,auVar46);
        uVar40 = vcmpps_avx512vl(auVar49,auVar47,1);
        auVar50 = vdivps_avx512vl(auVar48,local_2840);
        vandps_avx512vl(local_2820,auVar46);
        uVar37 = vcmpps_avx512vl(auVar50,auVar47,1);
        auVar46 = vdivps_avx512vl(auVar48,local_2820);
        auVar86 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                     CONCAT424(0x5d5e0b6b,
                                               CONCAT420(0x5d5e0b6b,
                                                         CONCAT416(0x5d5e0b6b,
                                                                   CONCAT412(0x5d5e0b6b,
                                                                             CONCAT48(0x5d5e0b6b,
                                                                                                                                                                            
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar43 = (bool)((byte)uVar41 & 1);
        local_2800._0_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._0_4_;
        bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
        local_2800._4_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._4_4_;
        bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
        fStack_27f8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._8_4_);
        bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
        fStack_27f4 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._12_4_);
        bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
        fStack_27f0 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._16_4_);
        bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
        fStack_27ec = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._20_4_);
        bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
        fStack_27e8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._24_4_);
        bVar43 = SUB81(uVar41 >> 7,0);
        register0x00000918 = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar49._28_4_;
        bVar43 = (bool)((byte)uVar40 & 1);
        local_27e0._0_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._0_4_;
        bVar43 = (bool)((byte)(uVar40 >> 1) & 1);
        local_27e0._4_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._4_4_;
        bVar43 = (bool)((byte)(uVar40 >> 2) & 1);
        fStack_27d8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._8_4_);
        bVar43 = (bool)((byte)(uVar40 >> 3) & 1);
        fStack_27d4 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._12_4_);
        bVar43 = (bool)((byte)(uVar40 >> 4) & 1);
        fStack_27d0 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._16_4_);
        bVar43 = (bool)((byte)(uVar40 >> 5) & 1);
        fStack_27cc = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._20_4_);
        bVar43 = (bool)((byte)(uVar40 >> 6) & 1);
        fStack_27c8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._24_4_);
        bVar43 = SUB81(uVar40 >> 7,0);
        register0x00000918 = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar50._28_4_;
        bVar43 = (bool)((byte)uVar37 & 1);
        local_27c0._0_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._0_4_;
        bVar43 = (bool)((byte)(uVar37 >> 1) & 1);
        local_27c0._4_4_ = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._4_4_;
        bVar43 = (bool)((byte)(uVar37 >> 2) & 1);
        fStack_27b8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._8_4_);
        bVar43 = (bool)((byte)(uVar37 >> 3) & 1);
        fStack_27b4 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._12_4_);
        bVar43 = (bool)((byte)(uVar37 >> 4) & 1);
        fStack_27b0 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._16_4_);
        bVar43 = (bool)((byte)(uVar37 >> 5) & 1);
        fStack_27ac = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._20_4_);
        bVar43 = (bool)((byte)(uVar37 >> 6) & 1);
        fStack_27a8 = (float)((uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._24_4_);
        bVar43 = SUB81(uVar37 >> 7,0);
        register0x00000918 = (uint)bVar43 * 0x5d5e0b6b | (uint)!bVar43 * auVar46._28_4_;
        uVar41 = vcmpps_avx512vl(_local_2800,ZEXT1632(auVar80),1);
        auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_27a0 = (uint)((byte)uVar41 & 1) * auVar46._0_4_;
        iStack_279c = (uint)((byte)(uVar41 >> 1) & 1) * auVar46._4_4_;
        iStack_2798 = (uint)((byte)(uVar41 >> 2) & 1) * auVar46._8_4_;
        iStack_2794 = (uint)((byte)(uVar41 >> 3) & 1) * auVar46._12_4_;
        iStack_2790 = (uint)((byte)(uVar41 >> 4) & 1) * auVar46._16_4_;
        iStack_278c = (uint)((byte)(uVar41 >> 5) & 1) * auVar46._20_4_;
        iStack_2788 = (uint)((byte)(uVar41 >> 6) & 1) * auVar46._24_4_;
        iStack_2784 = (uint)(byte)(uVar41 >> 7) * auVar46._28_4_;
        auVar47 = ZEXT1632(auVar80);
        uVar41 = vcmpps_avx512vl(_local_27e0,auVar47,5);
        auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar43 = (bool)((byte)uVar41 & 1);
        bVar6 = (bool)((byte)(uVar41 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar41 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar41 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar41 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar41 >> 6) & 1);
        bVar12 = SUB81(uVar41 >> 7,0);
        local_2780 = (uint)bVar43 * auVar46._0_4_ | (uint)!bVar43 * 0x30;
        uStack_277c = (uint)bVar6 * auVar46._4_4_ | (uint)!bVar6 * 0x30;
        uStack_2778 = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * 0x30;
        uStack_2774 = (uint)bVar8 * auVar46._12_4_ | (uint)!bVar8 * 0x30;
        uStack_2770 = (uint)bVar9 * auVar46._16_4_ | (uint)!bVar9 * 0x30;
        uStack_276c = (uint)bVar10 * auVar46._20_4_ | (uint)!bVar10 * 0x30;
        uStack_2768 = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * 0x30;
        uStack_2764 = (uint)bVar12 * auVar46._28_4_ | (uint)!bVar12 * 0x30;
        uVar41 = vcmpps_avx512vl(_local_27c0,auVar47,5);
        auVar46 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar43 = (bool)((byte)uVar41 & 1);
        bVar6 = (bool)((byte)(uVar41 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar41 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar41 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar41 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar41 >> 6) & 1);
        bVar12 = SUB81(uVar41 >> 7,0);
        local_2760 = (uint)bVar43 * auVar46._0_4_ | (uint)!bVar43 * 0x50;
        uStack_275c = (uint)bVar6 * auVar46._4_4_ | (uint)!bVar6 * 0x50;
        uStack_2758 = (uint)bVar7 * auVar46._8_4_ | (uint)!bVar7 * 0x50;
        uStack_2754 = (uint)bVar8 * auVar46._12_4_ | (uint)!bVar8 * 0x50;
        uStack_2750 = (uint)bVar9 * auVar46._16_4_ | (uint)!bVar9 * 0x50;
        uStack_274c = (uint)bVar10 * auVar46._20_4_ | (uint)!bVar10 * 0x50;
        uStack_2748 = (uint)bVar11 * auVar46._24_4_ | (uint)!bVar11 * 0x50;
        uStack_2744 = (uint)bVar12 * auVar46._28_4_ | (uint)!bVar12 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar107 = ZEXT3264(local_1e80);
        auVar46 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar47);
        local_2740._0_4_ =
             (uint)(bVar32 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar32 & 1) * local_1e80._0_4_;
        bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
        local_2740._4_4_ = (uint)bVar43 * auVar46._4_4_ | (uint)!bVar43 * local_1e80._4_4_;
        bVar43 = (bool)((byte)(uVar44 >> 2) & 1);
        local_2740._8_4_ = (uint)bVar43 * auVar46._8_4_ | (uint)!bVar43 * local_1e80._8_4_;
        bVar43 = (bool)((byte)(uVar44 >> 3) & 1);
        local_2740._12_4_ = (uint)bVar43 * auVar46._12_4_ | (uint)!bVar43 * local_1e80._12_4_;
        bVar43 = (bool)((byte)(uVar44 >> 4) & 1);
        local_2740._16_4_ = (uint)bVar43 * auVar46._16_4_ | (uint)!bVar43 * local_1e80._16_4_;
        bVar43 = (bool)((byte)(uVar44 >> 5) & 1);
        local_2740._20_4_ = (uint)bVar43 * auVar46._20_4_ | (uint)!bVar43 * local_1e80._20_4_;
        bVar43 = (bool)((byte)(uVar44 >> 6) & 1);
        local_2740._24_4_ = (uint)bVar43 * auVar46._24_4_ | (uint)!bVar43 * local_1e80._24_4_;
        bVar43 = SUB81(uVar44 >> 7,0);
        local_2740._28_4_ = (uint)bVar43 * auVar46._28_4_ | (uint)!bVar43 * local_1e80._28_4_;
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = ZEXT3264(auVar46);
        auVar47 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar47);
        local_2720._0_4_ =
             (uint)(bVar32 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar32 & 1) * auVar46._0_4_;
        bVar43 = (bool)((byte)(uVar44 >> 1) & 1);
        local_2720._4_4_ = (uint)bVar43 * auVar47._4_4_ | (uint)!bVar43 * auVar46._4_4_;
        bVar43 = (bool)((byte)(uVar44 >> 2) & 1);
        local_2720._8_4_ = (uint)bVar43 * auVar47._8_4_ | (uint)!bVar43 * auVar46._8_4_;
        bVar43 = (bool)((byte)(uVar44 >> 3) & 1);
        local_2720._12_4_ = (uint)bVar43 * auVar47._12_4_ | (uint)!bVar43 * auVar46._12_4_;
        bVar43 = (bool)((byte)(uVar44 >> 4) & 1);
        local_2720._16_4_ = (uint)bVar43 * auVar47._16_4_ | (uint)!bVar43 * auVar46._16_4_;
        bVar43 = (bool)((byte)(uVar44 >> 5) & 1);
        local_2720._20_4_ = (uint)bVar43 * auVar47._20_4_ | (uint)!bVar43 * auVar46._20_4_;
        bVar43 = (bool)((byte)(uVar44 >> 6) & 1);
        local_2720._24_4_ = (uint)bVar43 * auVar47._24_4_ | (uint)!bVar43 * auVar46._24_4_;
        bVar43 = SUB81(uVar44 >> 7,0);
        local_2720._28_4_ = (uint)bVar43 * auVar47._28_4_ | (uint)!bVar43 * auVar46._28_4_;
        bVar32 = ~bVar32;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar41 = 5;
        }
        else {
          uVar41 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2ae8 = ray + 0x100;
        puVar42 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar35 = (undefined1 (*) [32])local_1e40;
        local_2608 = (bvh->root).ptr;
        local_1e60 = local_2740;
        local_2ae0 = (undefined1 (*) [32])&local_2900;
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar108 = ZEXT3264(auVar46);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar102 = ZEXT3264(auVar46);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar101 = ZEXT3264(auVar46);
        local_2ad8 = uVar41;
LAB_007ab72c:
        pauVar35 = pauVar35 + -1;
        root.ptr = puVar42[-1];
        puVar42 = puVar42 + -1;
        if (root.ptr == 0xfffffffffffffff8) goto LAB_007ac771;
        local_2aa0 = *pauVar35;
        uVar40 = vcmpps_avx512vl(local_2aa0,local_2720,1);
        if ((char)uVar40 == '\0') {
LAB_007ac782:
          iVar33 = 2;
        }
        else {
          uVar38 = (undefined4)uVar40;
          iVar33 = 0;
          pRVar30 = ray;
          if ((uint)POPCOUNT(uVar38) <= uVar41) {
            do {
              local_2af0 = pRVar30;
              k = 0;
              for (uVar41 = uVar40; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              auVar86 = ZEXT1664(auVar86._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar43 = occluded1(This,bvh,root,k,&local_2af9,local_2af0,
                                 (TravRayK<8,_true> *)&local_28c0.field_0,context);
              bVar31 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar43) {
                bVar31 = 0;
              }
              bVar32 = bVar32 | bVar31;
              uVar40 = uVar40 - 1 & uVar40;
              pRVar30 = local_2af0;
            } while (uVar40 != 0);
            if (bVar32 == 0xff) {
              iVar33 = 3;
            }
            else {
              auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2720._0_4_ =
                   (uint)(bVar32 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar32 & 1) * local_2720._0_4_
              ;
              bVar43 = (bool)(bVar32 >> 1 & 1);
              local_2720._4_4_ = (uint)bVar43 * auVar46._4_4_ | (uint)!bVar43 * local_2720._4_4_;
              bVar43 = (bool)(bVar32 >> 2 & 1);
              local_2720._8_4_ = (uint)bVar43 * auVar46._8_4_ | (uint)!bVar43 * local_2720._8_4_;
              bVar43 = (bool)(bVar32 >> 3 & 1);
              local_2720._12_4_ = (uint)bVar43 * auVar46._12_4_ | (uint)!bVar43 * local_2720._12_4_;
              bVar43 = (bool)(bVar32 >> 4 & 1);
              local_2720._16_4_ = (uint)bVar43 * auVar46._16_4_ | (uint)!bVar43 * local_2720._16_4_;
              bVar43 = (bool)(bVar32 >> 5 & 1);
              local_2720._20_4_ = (uint)bVar43 * auVar46._20_4_ | (uint)!bVar43 * local_2720._20_4_;
              bVar43 = (bool)(bVar32 >> 6 & 1);
              local_2720._24_4_ = (uint)bVar43 * auVar46._24_4_ | (uint)!bVar43 * local_2720._24_4_;
              local_2720._28_4_ =
                   (uint)(bVar32 >> 7) * auVar46._28_4_ |
                   (uint)!(bool)(bVar32 >> 7) * local_2720._28_4_;
              iVar33 = 2;
            }
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar103 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            auVar104 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar105 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar106 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar107 = ZEXT3264(auVar46);
            uVar44 = uVar44 & 0xffffffff;
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar108 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar102 = ZEXT3264(auVar46);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar101 = ZEXT3264(auVar46);
            ray = local_2af0;
          }
          auVar93 = ZEXT3264(local_2aa0);
          uVar41 = local_2ad8;
          if ((uint)local_2ad8 < (uint)POPCOUNT(uVar38)) {
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007ac771;
                uVar14 = vcmpps_avx512vl(auVar93._0_32_,local_2720,9);
                if ((char)uVar14 == '\0') goto LAB_007ac782;
                local_2a48 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar31 = bVar32;
                if (local_2a48 == 0) goto LAB_007ac743;
                bVar31 = ~bVar32;
                lVar39 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar41 = 0;
                goto LAB_007ab95f;
              }
              auVar93 = ZEXT3264(auVar107._0_32_);
              uVar40 = 0;
              uVar37 = 8;
              do {
                uVar2 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar40 * 8);
                if (uVar2 != 8) {
                  uVar38 = *(undefined4 *)(root.ptr + 0x20 + uVar40 * 4);
                  auVar72._4_4_ = uVar38;
                  auVar72._0_4_ = uVar38;
                  auVar72._8_4_ = uVar38;
                  auVar72._12_4_ = uVar38;
                  auVar72._16_4_ = uVar38;
                  auVar72._20_4_ = uVar38;
                  auVar72._24_4_ = uVar38;
                  auVar72._28_4_ = uVar38;
                  auVar25._8_8_ = local_28c0._8_8_;
                  auVar25._0_8_ = local_28c0._0_8_;
                  auVar25._16_8_ = local_28c0._16_8_;
                  auVar25._24_8_ = local_28c0._24_8_;
                  auVar26._8_8_ = local_28c0._40_8_;
                  auVar26._0_8_ = local_28c0._32_8_;
                  auVar26._16_8_ = local_28c0._48_8_;
                  auVar26._24_8_ = local_28c0._56_8_;
                  auVar27._8_8_ = local_28c0._72_8_;
                  auVar27._0_8_ = local_28c0._64_8_;
                  auVar27._16_8_ = local_28c0._80_8_;
                  auVar27._24_8_ = local_28c0._88_8_;
                  auVar46 = vsubps_avx(auVar72,auVar25);
                  auVar87._0_4_ = (float)local_2800._0_4_ * auVar46._0_4_;
                  auVar87._4_4_ = (float)local_2800._4_4_ * auVar46._4_4_;
                  auVar87._8_4_ = fStack_27f8 * auVar46._8_4_;
                  auVar87._12_4_ = fStack_27f4 * auVar46._12_4_;
                  auVar87._16_4_ = fStack_27f0 * auVar46._16_4_;
                  auVar87._20_4_ = fStack_27ec * auVar46._20_4_;
                  auVar87._28_36_ = auVar86._28_36_;
                  auVar87._24_4_ = fStack_27e8 * auVar46._24_4_;
                  auVar49 = auVar87._0_32_;
                  auVar86 = ZEXT3264(auVar49);
                  uVar38 = *(undefined4 *)(root.ptr + 0x40 + uVar40 * 4);
                  auVar73._4_4_ = uVar38;
                  auVar73._0_4_ = uVar38;
                  auVar73._8_4_ = uVar38;
                  auVar73._12_4_ = uVar38;
                  auVar73._16_4_ = uVar38;
                  auVar73._20_4_ = uVar38;
                  auVar73._24_4_ = uVar38;
                  auVar73._28_4_ = uVar38;
                  auVar46 = vsubps_avx(auVar73,auVar26);
                  auVar89._0_4_ = (float)local_27e0._0_4_ * auVar46._0_4_;
                  auVar89._4_4_ = (float)local_27e0._4_4_ * auVar46._4_4_;
                  auVar89._8_4_ = fStack_27d8 * auVar46._8_4_;
                  auVar89._12_4_ = fStack_27d4 * auVar46._12_4_;
                  auVar89._16_4_ = fStack_27d0 * auVar46._16_4_;
                  auVar89._20_4_ = fStack_27cc * auVar46._20_4_;
                  auVar89._28_36_ = in_ZMM7._28_36_;
                  auVar89._24_4_ = fStack_27c8 * auVar46._24_4_;
                  auVar50 = auVar89._0_32_;
                  in_ZMM7 = ZEXT3264(auVar50);
                  uVar38 = *(undefined4 *)(root.ptr + 0x60 + uVar40 * 4);
                  auVar74._4_4_ = uVar38;
                  auVar74._0_4_ = uVar38;
                  auVar74._8_4_ = uVar38;
                  auVar74._12_4_ = uVar38;
                  auVar74._16_4_ = uVar38;
                  auVar74._20_4_ = uVar38;
                  auVar74._24_4_ = uVar38;
                  auVar74._28_4_ = uVar38;
                  auVar46 = vsubps_avx(auVar74,auVar27);
                  auVar91._0_4_ = (float)local_27c0._0_4_ * auVar46._0_4_;
                  auVar91._4_4_ = (float)local_27c0._4_4_ * auVar46._4_4_;
                  auVar91._8_4_ = fStack_27b8 * auVar46._8_4_;
                  auVar91._12_4_ = fStack_27b4 * auVar46._12_4_;
                  auVar91._16_4_ = fStack_27b0 * auVar46._16_4_;
                  auVar91._20_4_ = fStack_27ac * auVar46._20_4_;
                  auVar91._28_36_ = in_ZMM9._28_36_;
                  auVar91._24_4_ = fStack_27a8 * auVar46._24_4_;
                  auVar79 = auVar91._0_32_;
                  in_ZMM9 = ZEXT3264(auVar79);
                  uVar38 = *(undefined4 *)(root.ptr + 0x30 + uVar40 * 4);
                  auVar75._4_4_ = uVar38;
                  auVar75._0_4_ = uVar38;
                  auVar75._8_4_ = uVar38;
                  auVar75._12_4_ = uVar38;
                  auVar75._16_4_ = uVar38;
                  auVar75._20_4_ = uVar38;
                  auVar75._24_4_ = uVar38;
                  auVar75._28_4_ = uVar38;
                  auVar46 = vsubps_avx(auVar75,auVar25);
                  auVar19._4_4_ = (float)local_2800._4_4_ * auVar46._4_4_;
                  auVar19._0_4_ = (float)local_2800._0_4_ * auVar46._0_4_;
                  auVar19._8_4_ = fStack_27f8 * auVar46._8_4_;
                  auVar19._12_4_ = fStack_27f4 * auVar46._12_4_;
                  auVar19._16_4_ = fStack_27f0 * auVar46._16_4_;
                  auVar19._20_4_ = fStack_27ec * auVar46._20_4_;
                  auVar19._24_4_ = fStack_27e8 * auVar46._24_4_;
                  auVar19._28_4_ = (int)((ulong)local_28c0._24_8_ >> 0x20);
                  uVar38 = *(undefined4 *)(root.ptr + 0x50 + uVar40 * 4);
                  auVar76._4_4_ = uVar38;
                  auVar76._0_4_ = uVar38;
                  auVar76._8_4_ = uVar38;
                  auVar76._12_4_ = uVar38;
                  auVar76._16_4_ = uVar38;
                  auVar76._20_4_ = uVar38;
                  auVar76._24_4_ = uVar38;
                  auVar76._28_4_ = uVar38;
                  auVar46 = vsubps_avx(auVar76,auVar26);
                  auVar20._4_4_ = (float)local_27e0._4_4_ * auVar46._4_4_;
                  auVar20._0_4_ = (float)local_27e0._0_4_ * auVar46._0_4_;
                  auVar20._8_4_ = fStack_27d8 * auVar46._8_4_;
                  auVar20._12_4_ = fStack_27d4 * auVar46._12_4_;
                  auVar20._16_4_ = fStack_27d0 * auVar46._16_4_;
                  auVar20._20_4_ = fStack_27cc * auVar46._20_4_;
                  auVar20._24_4_ = fStack_27c8 * auVar46._24_4_;
                  auVar20._28_4_ = (int)((ulong)local_28c0._56_8_ >> 0x20);
                  uVar38 = *(undefined4 *)(root.ptr + 0x70 + uVar40 * 4);
                  auVar77._4_4_ = uVar38;
                  auVar77._0_4_ = uVar38;
                  auVar77._8_4_ = uVar38;
                  auVar77._12_4_ = uVar38;
                  auVar77._16_4_ = uVar38;
                  auVar77._20_4_ = uVar38;
                  auVar77._24_4_ = uVar38;
                  auVar77._28_4_ = uVar38;
                  auVar46 = vsubps_avx(auVar77,auVar27);
                  auVar21._4_4_ = (float)local_27c0._4_4_ * auVar46._4_4_;
                  auVar21._0_4_ = (float)local_27c0._0_4_ * auVar46._0_4_;
                  auVar21._8_4_ = fStack_27b8 * auVar46._8_4_;
                  auVar21._12_4_ = fStack_27b4 * auVar46._12_4_;
                  auVar21._16_4_ = fStack_27b0 * auVar46._16_4_;
                  auVar21._20_4_ = fStack_27ac * auVar46._20_4_;
                  auVar21._24_4_ = fStack_27a8 * auVar46._24_4_;
                  auVar21._28_4_ = (int)((ulong)local_28c0._88_8_ >> 0x20);
                  auVar46 = vminps_avx(auVar49,auVar19);
                  auVar47 = vminps_avx(auVar50,auVar20);
                  auVar46 = vmaxps_avx(auVar46,auVar47);
                  auVar47 = vminps_avx(auVar79,auVar21);
                  auVar46 = vmaxps_avx(auVar46,auVar47);
                  auVar48 = vmulps_avx512vl(auVar46,auVar108._0_32_);
                  auVar46 = vmaxps_avx(auVar49,auVar19);
                  auVar47 = vmaxps_avx(auVar50,auVar20);
                  auVar47 = vminps_avx(auVar46,auVar47);
                  auVar46 = vmaxps_avx(auVar79,auVar21);
                  auVar46 = vminps_avx(auVar47,auVar46);
                  auVar47 = vmulps_avx512vl(auVar46,auVar102._0_32_);
                  auVar46 = vmaxps_avx(auVar48,local_2740);
                  auVar47 = vminps_avx(auVar47,local_2720);
                  uVar13 = vcmpps_avx512vl(auVar46,auVar47,2);
                  if ((byte)uVar13 != 0) {
                    auVar46 = vblendmps_avx512vl(auVar107._0_32_,auVar48);
                    bVar43 = (bool)((byte)uVar13 & 1);
                    bVar6 = (bool)((byte)(uVar13 >> 1) & 1);
                    bVar7 = (bool)((byte)(uVar13 >> 2) & 1);
                    bVar8 = (bool)((byte)(uVar13 >> 3) & 1);
                    bVar9 = (bool)((byte)(uVar13 >> 4) & 1);
                    bVar10 = (bool)((byte)(uVar13 >> 5) & 1);
                    bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                    bVar12 = SUB81(uVar13 >> 7,0);
                    if (uVar37 != 8) {
                      *puVar42 = uVar37;
                      puVar42 = puVar42 + 1;
                      *pauVar35 = auVar93._0_32_;
                      pauVar35 = pauVar35 + 1;
                    }
                    auVar93 = ZEXT3264(CONCAT428((uint)bVar12 * auVar46._28_4_ |
                                                 (uint)!bVar12 * auVar48._28_4_,
                                                 CONCAT424((uint)bVar11 * auVar46._24_4_ |
                                                           (uint)!bVar11 * auVar48._24_4_,
                                                           CONCAT420((uint)bVar10 * auVar46._20_4_ |
                                                                     (uint)!bVar10 * auVar48._20_4_,
                                                                     CONCAT416((uint)bVar9 *
                                                                               auVar46._16_4_ |
                                                                               (uint)!bVar9 *
                                                                               auVar48._16_4_,
                                                                               CONCAT412((uint)bVar8
                                                                                         * auVar46.
                                                  _12_4_ | (uint)!bVar8 * auVar48._12_4_,
                                                  CONCAT48((uint)bVar7 * auVar46._8_4_ |
                                                           (uint)!bVar7 * auVar48._8_4_,
                                                           CONCAT44((uint)bVar6 * auVar46._4_4_ |
                                                                    (uint)!bVar6 * auVar48._4_4_,
                                                                    (uint)bVar43 * auVar46._0_4_ |
                                                                    (uint)!bVar43 * auVar48._0_4_)))
                                                  )))));
                    uVar37 = uVar2;
                  }
                }
              } while ((uVar2 != 8) && (bVar43 = uVar40 < 3, uVar40 = uVar40 + 1, bVar43));
              iVar33 = 0;
              if (uVar37 == 8) {
LAB_007ab90e:
                bVar43 = false;
                iVar33 = 4;
              }
              else {
                uVar14 = vcmpps_avx512vl(auVar93._0_32_,local_2720,9);
                bVar43 = true;
                if ((uint)POPCOUNT((int)uVar14) <= (uint)local_2ad8) {
                  *puVar42 = uVar37;
                  puVar42 = puVar42 + 1;
                  *pauVar35 = auVar93._0_32_;
                  pauVar35 = pauVar35 + 1;
                  goto LAB_007ab90e;
                }
              }
              root.ptr = uVar37;
            } while (bVar43);
          }
        }
        goto LAB_007ac774;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar41 = local_2a40 + 1;
    lVar39 = lVar39 + 0xe0;
    if (local_2a48 <= uVar41) break;
LAB_007ab95f:
    local_2a38 = uVar41 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar40 = 0;
    local_2af8 = lVar39;
    local_2a40 = uVar41;
    bVar36 = bVar31;
    while (uVar41 = (ulong)*(uint *)(lVar39 + uVar40 * 4), uVar41 != 0xffffffff) {
      uVar38 = *(undefined4 *)(lVar39 + -0xc0 + uVar40 * 4);
      auVar78._4_4_ = uVar38;
      auVar78._0_4_ = uVar38;
      auVar78._8_4_ = uVar38;
      auVar78._12_4_ = uVar38;
      auVar78._16_4_ = uVar38;
      auVar78._20_4_ = uVar38;
      auVar78._24_4_ = uVar38;
      auVar78._28_4_ = uVar38;
      uVar38 = *(undefined4 *)(lVar39 + -0xb0 + uVar40 * 4);
      auVar81._4_4_ = uVar38;
      auVar81._0_4_ = uVar38;
      auVar81._8_4_ = uVar38;
      auVar81._12_4_ = uVar38;
      auVar81._16_4_ = uVar38;
      auVar81._20_4_ = uVar38;
      auVar81._24_4_ = uVar38;
      auVar81._28_4_ = uVar38;
      uVar38 = *(undefined4 *)(lVar39 + -0xa0 + uVar40 * 4);
      auVar82._4_4_ = uVar38;
      auVar82._0_4_ = uVar38;
      auVar82._8_4_ = uVar38;
      auVar82._12_4_ = uVar38;
      auVar82._16_4_ = uVar38;
      auVar82._20_4_ = uVar38;
      auVar82._24_4_ = uVar38;
      auVar82._28_4_ = uVar38;
      uVar38 = *(undefined4 *)(lVar39 + -0x90 + uVar40 * 4);
      local_2aa0._4_4_ = uVar38;
      local_2aa0._0_4_ = uVar38;
      local_2aa0._8_4_ = uVar38;
      local_2aa0._12_4_ = uVar38;
      local_2aa0._16_4_ = uVar38;
      local_2aa0._20_4_ = uVar38;
      local_2aa0._24_4_ = uVar38;
      local_2aa0._28_4_ = uVar38;
      uVar38 = *(undefined4 *)(lVar39 + -0x80 + uVar40 * 4);
      local_2a20._4_4_ = uVar38;
      local_2a20._0_4_ = uVar38;
      local_2a20._8_4_ = uVar38;
      local_2a20._12_4_ = uVar38;
      local_2a20._16_4_ = uVar38;
      local_2a20._20_4_ = uVar38;
      local_2a20._24_4_ = uVar38;
      local_2a20._28_4_ = uVar38;
      uVar38 = *(undefined4 *)(lVar39 + -0x70 + uVar40 * 4);
      local_2640._4_4_ = uVar38;
      local_2640._0_4_ = uVar38;
      local_2640._8_4_ = uVar38;
      local_2640._12_4_ = uVar38;
      local_2640._16_4_ = uVar38;
      local_2640._20_4_ = uVar38;
      local_2640._24_4_ = uVar38;
      local_2640._28_4_ = uVar38;
      local_2660 = *(undefined4 *)(lVar39 + -0x60 + uVar40 * 4);
      uStack_265c = local_2660;
      uStack_2658 = local_2660;
      uStack_2654 = local_2660;
      uStack_2650 = local_2660;
      uStack_264c = local_2660;
      uStack_2648 = local_2660;
      uStack_2644 = local_2660;
      local_2680 = *(undefined4 *)(lVar39 + -0x50 + uVar40 * 4);
      uStack_267c = local_2680;
      uStack_2678 = local_2680;
      uStack_2674 = local_2680;
      uStack_2670 = local_2680;
      uStack_266c = local_2680;
      uStack_2668 = local_2680;
      uStack_2664 = local_2680;
      local_26a0 = *(undefined4 *)(lVar39 + -0x40 + uVar40 * 4);
      uStack_269c = local_26a0;
      uStack_2698 = local_26a0;
      uStack_2694 = local_26a0;
      uStack_2690 = local_26a0;
      uStack_268c = local_26a0;
      uStack_2688 = local_26a0;
      uStack_2684 = local_26a0;
      local_26c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar39 + -0x30 + uVar40 * 4)));
      local_26e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar39 + -0x20 + uVar40 * 4)));
      local_2700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar39 + -0x10 + uVar40 * 4)));
      local_2a30 = *(undefined8 *)(local_2a38 + 0xd0);
      uStack_2a28 = *(undefined8 *)(local_2a38 + 0xd8);
      auVar46 = *(undefined1 (*) [32])ray;
      auVar47 = *(undefined1 (*) [32])(ray + 0x20);
      auVar48 = *(undefined1 (*) [32])(ray + 0x40);
      auVar49 = *(undefined1 (*) [32])(ray + 0x80);
      in_ZMM7 = ZEXT3264(auVar49);
      auVar50 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar79 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar78 = vsubps_avx(auVar78,auVar46);
      auVar81 = vsubps_avx(auVar81,auVar47);
      auVar82 = vsubps_avx(auVar82,auVar48);
      in_ZMM9 = ZEXT3264(auVar82);
      auVar65 = vsubps_avx(local_2aa0,auVar46);
      auVar64 = vsubps_avx(local_2a20,auVar47);
      auVar51 = vsubps_avx512vl(local_2640,auVar48);
      auVar52 = vsubps_avx512vl(local_26c0,auVar46);
      auVar53 = vsubps_avx512vl(local_26e0,auVar47);
      auVar54 = vsubps_avx512vl(local_2700,auVar48);
      auVar55 = vsubps_avx512vl(auVar52,auVar78);
      auVar56 = vsubps_avx512vl(auVar53,auVar81);
      auVar57 = vsubps_avx512vl(auVar54,auVar82);
      auVar58 = vsubps_avx512vl(auVar78,auVar65);
      auVar59 = vsubps_avx512vl(auVar81,auVar64);
      auVar60 = vsubps_avx512vl(auVar82,auVar51);
      auVar61 = vaddps_avx512vl(auVar52,auVar78);
      auVar62 = vaddps_avx512vl(auVar53,auVar81);
      auVar63 = vaddps_avx512vl(auVar54,auVar82);
      auVar47._4_4_ = auVar57._4_4_ * auVar62._4_4_;
      auVar47._0_4_ = auVar57._0_4_ * auVar62._0_4_;
      auVar47._8_4_ = auVar57._8_4_ * auVar62._8_4_;
      auVar47._12_4_ = auVar57._12_4_ * auVar62._12_4_;
      auVar47._16_4_ = auVar57._16_4_ * auVar62._16_4_;
      auVar47._20_4_ = auVar57._20_4_ * auVar62._20_4_;
      auVar47._24_4_ = auVar57._24_4_ * auVar62._24_4_;
      auVar47._28_4_ = auVar46._28_4_;
      auVar18 = vfmsub231ps_fma(auVar47,auVar56,auVar63);
      auVar48._4_4_ = auVar55._4_4_ * auVar63._4_4_;
      auVar48._0_4_ = auVar55._0_4_ * auVar63._0_4_;
      auVar48._8_4_ = auVar55._8_4_ * auVar63._8_4_;
      auVar48._12_4_ = auVar55._12_4_ * auVar63._12_4_;
      auVar48._16_4_ = auVar55._16_4_ * auVar63._16_4_;
      auVar48._20_4_ = auVar55._20_4_ * auVar63._20_4_;
      auVar48._24_4_ = auVar55._24_4_ * auVar63._24_4_;
      auVar48._28_4_ = auVar63._28_4_;
      auVar80 = vfmsub231ps_fma(auVar48,auVar57,auVar61);
      auVar63._4_4_ = auVar56._4_4_ * auVar61._4_4_;
      auVar63._0_4_ = auVar56._0_4_ * auVar61._0_4_;
      auVar63._8_4_ = auVar56._8_4_ * auVar61._8_4_;
      auVar63._12_4_ = auVar56._12_4_ * auVar61._12_4_;
      auVar63._16_4_ = auVar56._16_4_ * auVar61._16_4_;
      auVar63._20_4_ = auVar56._20_4_ * auVar61._20_4_;
      auVar63._24_4_ = auVar56._24_4_ * auVar61._24_4_;
      auVar63._28_4_ = auVar61._28_4_;
      auVar85 = vfmsub231ps_fma(auVar63,auVar55,auVar62);
      fVar92 = auVar79._0_4_;
      auVar62._0_4_ = fVar92 * auVar85._0_4_;
      fVar94 = auVar79._4_4_;
      auVar62._4_4_ = fVar94 * auVar85._4_4_;
      fVar95 = auVar79._8_4_;
      auVar62._8_4_ = fVar95 * auVar85._8_4_;
      fVar96 = auVar79._12_4_;
      auVar62._12_4_ = fVar96 * auVar85._12_4_;
      fVar97 = auVar79._16_4_;
      auVar62._16_4_ = fVar97 * 0.0;
      fVar98 = auVar79._20_4_;
      auVar62._20_4_ = fVar98 * 0.0;
      fVar99 = auVar79._24_4_;
      auVar62._24_4_ = fVar99 * 0.0;
      auVar62._28_4_ = 0;
      auVar80 = vfmadd231ps_fma(auVar62,auVar50,ZEXT1632(auVar80));
      auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar49,ZEXT1632(auVar18));
      auVar66._0_4_ = auVar65._0_4_ + auVar78._0_4_;
      auVar66._4_4_ = auVar65._4_4_ + auVar78._4_4_;
      auVar66._8_4_ = auVar65._8_4_ + auVar78._8_4_;
      auVar66._12_4_ = auVar65._12_4_ + auVar78._12_4_;
      auVar66._16_4_ = auVar65._16_4_ + auVar78._16_4_;
      auVar66._20_4_ = auVar65._20_4_ + auVar78._20_4_;
      auVar66._24_4_ = auVar65._24_4_ + auVar78._24_4_;
      auVar66._28_4_ = auVar65._28_4_ + auVar78._28_4_;
      auVar67._0_4_ = auVar64._0_4_ + auVar81._0_4_;
      auVar67._4_4_ = auVar64._4_4_ + auVar81._4_4_;
      auVar67._8_4_ = auVar64._8_4_ + auVar81._8_4_;
      auVar67._12_4_ = auVar64._12_4_ + auVar81._12_4_;
      auVar67._16_4_ = auVar64._16_4_ + auVar81._16_4_;
      auVar67._20_4_ = auVar64._20_4_ + auVar81._20_4_;
      auVar67._24_4_ = auVar64._24_4_ + auVar81._24_4_;
      auVar67._28_4_ = auVar64._28_4_ + auVar81._28_4_;
      auVar46 = vaddps_avx512vl(auVar82,auVar51);
      auVar47 = vmulps_avx512vl(auVar67,auVar60);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar59,auVar46);
      auVar46 = vmulps_avx512vl(auVar46,auVar58);
      auVar46 = vfmsub231ps_avx512vl(auVar46,auVar60,auVar66);
      auVar48 = vmulps_avx512vl(auVar66,auVar59);
      auVar48 = vfmsub231ps_avx512vl(auVar48,auVar58,auVar67);
      auVar63 = vsubps_avx512vl(auVar65,auVar52);
      auVar61._4_4_ = fVar94 * auVar48._4_4_;
      auVar61._0_4_ = fVar92 * auVar48._0_4_;
      auVar61._8_4_ = fVar95 * auVar48._8_4_;
      auVar61._12_4_ = fVar96 * auVar48._12_4_;
      auVar61._16_4_ = fVar97 * auVar48._16_4_;
      auVar61._20_4_ = fVar98 * auVar48._20_4_;
      auVar61._24_4_ = fVar99 * auVar48._24_4_;
      auVar61._28_4_ = auVar48._28_4_;
      auVar46 = vfmadd231ps_avx512vl(auVar61,auVar50,auVar46);
      auVar48 = vsubps_avx512vl(auVar64,auVar53);
      auVar18 = vfmadd231ps_fma(auVar46,auVar49,auVar47);
      auVar47 = vsubps_avx512vl(auVar51,auVar54);
      auVar86 = ZEXT3264(auVar47);
      auVar46 = vaddps_avx512vl(auVar65,auVar52);
      auVar64 = vaddps_avx512vl(auVar64,auVar53);
      auVar65 = vaddps_avx512vl(auVar51,auVar54);
      auVar61 = vmulps_avx512vl(auVar64,auVar47);
      auVar61 = vfmsub231ps_avx512vl(auVar61,auVar48,auVar65);
      auVar65 = vmulps_avx512vl(auVar65,auVar63);
      auVar51 = vfmsub231ps_avx512vl(auVar65,auVar47,auVar46);
      auVar65._4_4_ = auVar46._4_4_ * auVar48._4_4_;
      auVar65._0_4_ = auVar46._0_4_ * auVar48._0_4_;
      auVar65._8_4_ = auVar46._8_4_ * auVar48._8_4_;
      auVar65._12_4_ = auVar46._12_4_ * auVar48._12_4_;
      auVar65._16_4_ = auVar46._16_4_ * auVar48._16_4_;
      auVar65._20_4_ = auVar46._20_4_ * auVar48._20_4_;
      auVar65._24_4_ = auVar46._24_4_ * auVar48._24_4_;
      auVar65._28_4_ = auVar46._28_4_;
      auVar85 = vfmsub231ps_fma(auVar65,auVar63,auVar64);
      auVar46 = vmulps_avx512vl(ZEXT1632(auVar85),auVar79);
      auVar46 = vfmadd231ps_avx512vl(auVar46,auVar50,auVar51);
      auVar65 = vfmadd231ps_avx512vl(auVar46,auVar49,auVar61);
      auVar64 = vaddps_avx512vl(auVar65,ZEXT1632(CONCAT412(auVar80._12_4_ + auVar18._12_4_,
                                                           CONCAT48(auVar80._8_4_ + auVar18._8_4_,
                                                                    CONCAT44(auVar80._4_4_ +
                                                                             auVar18._4_4_,
                                                                             auVar80._0_4_ +
                                                                             auVar18._0_4_)))));
      auVar52 = auVar103._0_32_;
      vandps_avx512vl(auVar64,auVar52);
      auVar46._8_4_ = 0x34000000;
      auVar46._0_8_ = 0x3400000034000000;
      auVar46._12_4_ = 0x34000000;
      auVar46._16_4_ = 0x34000000;
      auVar46._20_4_ = 0x34000000;
      auVar46._24_4_ = 0x34000000;
      auVar46._28_4_ = 0x34000000;
      auVar46 = vmulps_avx512vl(auVar64,auVar46);
      auVar61 = vminps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar18));
      auVar61 = vminps_avx512vl(auVar61,auVar65);
      auVar51 = vxorps_avx512vl(auVar46,auVar101._0_32_);
      uVar14 = vcmpps_avx512vl(auVar61,auVar51,5);
      auVar61 = vmaxps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar18));
      auVar65 = vmaxps_avx512vl(auVar61,auVar65);
      uVar15 = vcmpps_avx512vl(auVar65,auVar46,2);
      bVar34 = ((byte)uVar14 | (byte)uVar15) & bVar36;
      if (bVar34 != 0) {
        auVar46 = vmulps_avx512vl(auVar59,auVar57);
        auVar65 = vmulps_avx512vl(auVar55,auVar60);
        auVar61 = vmulps_avx512vl(auVar58,auVar56);
        auVar51 = vmulps_avx512vl(auVar48,auVar60);
        auVar53 = vmulps_avx512vl(auVar58,auVar47);
        auVar54 = vmulps_avx512vl(auVar63,auVar59);
        auVar56 = vfmsub213ps_avx512vl(auVar56,auVar60,auVar46);
        auVar57 = vfmsub213ps_avx512vl(auVar57,auVar58,auVar65);
        auVar55 = vfmsub213ps_avx512vl(auVar55,auVar59,auVar61);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar59,auVar51);
        auVar63 = vfmsub213ps_avx512vl(auVar63,auVar60,auVar53);
        auVar48 = vfmsub213ps_avx512vl(auVar48,auVar58,auVar54);
        vandps_avx512vl(auVar46,auVar52);
        vandps_avx512vl(auVar51,auVar52);
        uVar37 = vcmpps_avx512vl(auVar48,auVar48,1);
        vandps_avx512vl(auVar65,auVar52);
        vandps_avx512vl(auVar53,auVar52);
        uVar2 = vcmpps_avx512vl(auVar48,auVar48,1);
        vandps_avx512vl(auVar61,auVar52);
        vandps_avx512vl(auVar54,auVar52);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar101 = ZEXT3264(auVar46);
        uVar13 = vcmpps_avx512vl(auVar48,auVar48,1);
        bVar43 = (bool)((byte)uVar37 & 1);
        auVar45._0_4_ = (uint)bVar43 * auVar56._0_4_ | (uint)!bVar43 * auVar47._0_4_;
        bVar43 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar43 * auVar56._4_4_ | (uint)!bVar43 * auVar47._4_4_;
        bVar43 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar43 * auVar56._8_4_ | (uint)!bVar43 * auVar47._8_4_;
        bVar43 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar43 * auVar56._12_4_ | (uint)!bVar43 * auVar47._12_4_;
        bVar43 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar43 * auVar56._16_4_ | (uint)!bVar43 * auVar47._16_4_;
        auVar52._0_16_ = auVar45;
        bVar43 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar43 * auVar56._20_4_ | (uint)!bVar43 * auVar47._20_4_;
        bVar43 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar43 * auVar56._24_4_ | (uint)!bVar43 * auVar47._24_4_;
        bVar43 = SUB81(uVar37 >> 7,0);
        auVar52._28_4_ = (uint)bVar43 * auVar56._28_4_ | (uint)!bVar43 * auVar47._28_4_;
        auVar86 = ZEXT3264(auVar52);
        bVar43 = (bool)((byte)uVar2 & 1);
        auVar53._0_4_ = (uint)bVar43 * auVar57._0_4_ | (uint)!bVar43 * auVar63._0_4_;
        bVar43 = (bool)((byte)(uVar2 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar43 * auVar57._4_4_ | (uint)!bVar43 * auVar63._4_4_;
        bVar43 = (bool)((byte)(uVar2 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar43 * auVar57._8_4_ | (uint)!bVar43 * auVar63._8_4_;
        bVar43 = (bool)((byte)(uVar2 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar43 * auVar57._12_4_ | (uint)!bVar43 * auVar63._12_4_;
        bVar43 = (bool)((byte)(uVar2 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar43 * auVar57._16_4_ | (uint)!bVar43 * auVar63._16_4_;
        bVar43 = (bool)((byte)(uVar2 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar43 * auVar57._20_4_ | (uint)!bVar43 * auVar63._20_4_;
        bVar43 = (bool)((byte)(uVar2 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar43 * auVar57._24_4_ | (uint)!bVar43 * auVar63._24_4_;
        bVar43 = SUB81(uVar2 >> 7,0);
        auVar53._28_4_ = (uint)bVar43 * auVar57._28_4_ | (uint)!bVar43 * auVar63._28_4_;
        bVar43 = (bool)((byte)uVar13 & 1);
        auVar54._0_4_ = (float)((uint)bVar43 * auVar55._0_4_ | (uint)!bVar43 * auVar48._0_4_);
        bVar43 = (bool)((byte)(uVar13 >> 1) & 1);
        auVar54._4_4_ = (float)((uint)bVar43 * auVar55._4_4_ | (uint)!bVar43 * auVar48._4_4_);
        bVar43 = (bool)((byte)(uVar13 >> 2) & 1);
        auVar54._8_4_ = (float)((uint)bVar43 * auVar55._8_4_ | (uint)!bVar43 * auVar48._8_4_);
        bVar43 = (bool)((byte)(uVar13 >> 3) & 1);
        auVar54._12_4_ = (float)((uint)bVar43 * auVar55._12_4_ | (uint)!bVar43 * auVar48._12_4_);
        bVar43 = (bool)((byte)(uVar13 >> 4) & 1);
        auVar54._16_4_ = (float)((uint)bVar43 * auVar55._16_4_ | (uint)!bVar43 * auVar48._16_4_);
        bVar43 = (bool)((byte)(uVar13 >> 5) & 1);
        auVar54._20_4_ = (float)((uint)bVar43 * auVar55._20_4_ | (uint)!bVar43 * auVar48._20_4_);
        bVar43 = (bool)((byte)(uVar13 >> 6) & 1);
        auVar54._24_4_ = (float)((uint)bVar43 * auVar55._24_4_ | (uint)!bVar43 * auVar48._24_4_);
        bVar43 = SUB81(uVar13 >> 7,0);
        auVar54._28_4_ = (uint)bVar43 * auVar55._28_4_ | (uint)!bVar43 * auVar48._28_4_;
        auVar51._4_4_ = fVar94 * auVar54._4_4_;
        auVar51._0_4_ = fVar92 * auVar54._0_4_;
        auVar51._8_4_ = fVar95 * auVar54._8_4_;
        auVar51._12_4_ = fVar96 * auVar54._12_4_;
        auVar51._16_4_ = fVar97 * auVar54._16_4_;
        auVar51._20_4_ = fVar98 * auVar54._20_4_;
        auVar51._24_4_ = fVar99 * auVar54._24_4_;
        auVar51._28_4_ = auVar79._28_4_;
        auVar85 = vfmadd213ps_fma(auVar50,auVar53,auVar51);
        auVar85 = vfmadd213ps_fma(auVar49,auVar52,ZEXT1632(auVar85));
        auVar49 = ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                     CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                              CONCAT44(auVar85._4_4_ + auVar85._4_4_,
                                                       auVar85._0_4_ + auVar85._0_4_))));
        in_ZMM7 = ZEXT3264(auVar49);
        auVar50._0_4_ = auVar82._0_4_ * auVar54._0_4_;
        auVar50._4_4_ = auVar82._4_4_ * auVar54._4_4_;
        auVar50._8_4_ = auVar82._8_4_ * auVar54._8_4_;
        auVar50._12_4_ = auVar82._12_4_ * auVar54._12_4_;
        auVar50._16_4_ = auVar82._16_4_ * auVar54._16_4_;
        auVar50._20_4_ = auVar82._20_4_ * auVar54._20_4_;
        auVar50._24_4_ = auVar82._24_4_ * auVar54._24_4_;
        auVar50._28_4_ = 0;
        auVar85 = vfmadd213ps_fma(auVar81,auVar53,auVar50);
        auVar17 = vfmadd213ps_fma(auVar78,auVar52,ZEXT1632(auVar85));
        auVar47 = vrcp14ps_avx512vl(auVar49);
        auVar48 = vxorps_avx512vl(auVar49,auVar46);
        auVar50 = auVar105._0_32_;
        auVar46 = vfnmadd213ps_avx512vl(auVar47,auVar49,auVar50);
        auVar85 = vfmadd132ps_fma(auVar46,auVar47,auVar47);
        in_ZMM9 = ZEXT1664(auVar85);
        auVar46 = *(undefined1 (*) [32])(ray + 0x100);
        auVar47 = ZEXT1632(CONCAT412(auVar85._12_4_ * (auVar17._12_4_ + auVar17._12_4_),
                                     CONCAT48(auVar85._8_4_ * (auVar17._8_4_ + auVar17._8_4_),
                                              CONCAT44(auVar85._4_4_ *
                                                       (auVar17._4_4_ + auVar17._4_4_),
                                                       auVar85._0_4_ *
                                                       (auVar17._0_4_ + auVar17._0_4_)))));
        uVar14 = vcmpps_avx512vl(auVar47,auVar46,2);
        uVar15 = vcmpps_avx512vl(auVar47,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar16 = vcmpps_avx512vl(auVar49,auVar48,4);
        bVar34 = bVar34 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
        if (bVar34 != 0) {
          pGVar3 = (context->scene->geometries).items[uVar41].ptr;
          uVar1 = pGVar3->mask;
          auVar49._4_4_ = uVar1;
          auVar49._0_4_ = uVar1;
          auVar49._8_4_ = uVar1;
          auVar49._12_4_ = uVar1;
          auVar49._16_4_ = uVar1;
          auVar49._20_4_ = uVar1;
          auVar49._24_4_ = uVar1;
          auVar49._28_4_ = uVar1;
          uVar14 = vptestmd_avx512vl(auVar49,*(undefined1 (*) [32])(ray + 0x120));
          bVar34 = bVar34 & (byte)uVar14;
          uVar41 = (ulong)bVar34;
          lVar39 = local_2af8;
          if (bVar34 != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar41 = vcmpps_avx512vl(auVar64,auVar104._0_32_,5);
              auVar48 = vrcp14ps_avx512vl(auVar64);
              auVar49 = vfnmadd213ps_avx512vl(auVar64,auVar48,auVar50);
              auVar48 = vfmadd132ps_avx512vl(auVar49,auVar48,auVar48);
              fVar94 = (float)((uint)((byte)uVar41 & 1) * auVar48._0_4_);
              fVar92 = (float)((uint)((byte)(uVar41 >> 1) & 1) * auVar48._4_4_);
              fVar95 = (float)((uint)((byte)(uVar41 >> 2) & 1) * auVar48._8_4_);
              fVar96 = (float)((uint)((byte)(uVar41 >> 3) & 1) * auVar48._12_4_);
              fVar97 = (float)((uint)((byte)(uVar41 >> 4) & 1) * auVar48._16_4_);
              fVar98 = (float)((uint)((byte)(uVar41 >> 5) & 1) * auVar48._20_4_);
              fVar99 = (float)((uint)((byte)(uVar41 >> 6) & 1) * auVar48._24_4_);
              auVar79._0_4_ = fVar94 * auVar80._0_4_;
              auVar79._4_4_ = fVar92 * auVar80._4_4_;
              auVar79._8_4_ = fVar95 * auVar80._8_4_;
              auVar79._12_4_ = fVar96 * auVar80._12_4_;
              auVar79._16_4_ = fVar97 * 0.0;
              auVar79._20_4_ = fVar98 * 0.0;
              auVar79._24_4_ = fVar99 * 0.0;
              auVar79._28_4_ = 0;
              local_2980 = vminps_avx512vl(auVar79,auVar50);
              auVar64._0_4_ = fVar94 * auVar18._0_4_;
              auVar64._4_4_ = fVar92 * auVar18._4_4_;
              auVar64._8_4_ = fVar95 * auVar18._8_4_;
              auVar64._12_4_ = fVar96 * auVar18._12_4_;
              auVar64._16_4_ = fVar97 * 0.0;
              auVar64._20_4_ = fVar98 * 0.0;
              auVar64._24_4_ = fVar99 * 0.0;
              auVar64._28_4_ = 0;
              local_2960 = vminps_avx512vl(auVar64,auVar50);
              pRVar4 = context->user;
              local_2920 = vpbroadcastd_avx512vl();
              local_2940 = vpbroadcastd_avx512vl();
              in_ZMM7 = ZEXT3264(local_2940);
              local_29e0[0] = (RTCHitN)(char)auVar45._0_4_;
              local_29e0[1] = (RTCHitN)SUB41(auVar45._0_4_,1);
              local_29e0[2] = (RTCHitN)SUB41(auVar45._0_4_,2);
              local_29e0[3] = (RTCHitN)SUB41(auVar45._0_4_,3);
              local_29e0[4] = (RTCHitN)(char)auVar45._4_4_;
              local_29e0[5] = (RTCHitN)SUB41(auVar45._4_4_,1);
              local_29e0[6] = (RTCHitN)SUB41(auVar45._4_4_,2);
              local_29e0[7] = (RTCHitN)SUB41(auVar45._4_4_,3);
              local_29e0[8] = (RTCHitN)(char)auVar45._8_4_;
              local_29e0[9] = (RTCHitN)SUB41(auVar45._8_4_,1);
              local_29e0[10] = (RTCHitN)SUB41(auVar45._8_4_,2);
              local_29e0[0xb] = (RTCHitN)SUB41(auVar45._8_4_,3);
              local_29e0[0xc] = (RTCHitN)(char)auVar45._12_4_;
              local_29e0[0xd] = (RTCHitN)SUB41(auVar45._12_4_,1);
              local_29e0[0xe] = (RTCHitN)SUB41(auVar45._12_4_,2);
              local_29e0[0xf] = (RTCHitN)SUB41(auVar45._12_4_,3);
              local_29e0[0x10] = (RTCHitN)(char)auVar52._16_4_;
              local_29e0[0x11] = (RTCHitN)(char)(auVar52._16_4_ >> 8);
              local_29e0[0x12] = (RTCHitN)(char)(auVar52._16_4_ >> 0x10);
              local_29e0[0x13] = (RTCHitN)(char)(auVar52._16_4_ >> 0x18);
              local_29e0[0x14] = (RTCHitN)(char)auVar52._20_4_;
              local_29e0[0x15] = (RTCHitN)(char)(auVar52._20_4_ >> 8);
              local_29e0[0x16] = (RTCHitN)(char)(auVar52._20_4_ >> 0x10);
              local_29e0[0x17] = (RTCHitN)(char)(auVar52._20_4_ >> 0x18);
              local_29e0[0x18] = (RTCHitN)(char)auVar52._24_4_;
              local_29e0[0x19] = (RTCHitN)(char)(auVar52._24_4_ >> 8);
              local_29e0[0x1a] = (RTCHitN)(char)(auVar52._24_4_ >> 0x10);
              local_29e0[0x1b] = (RTCHitN)(char)(auVar52._24_4_ >> 0x18);
              local_29e0[0x1c] = (RTCHitN)(char)auVar52._28_4_;
              local_29e0[0x1d] = (RTCHitN)(char)(auVar52._28_4_ >> 8);
              local_29e0[0x1e] = (RTCHitN)(char)(auVar52._28_4_ >> 0x10);
              local_29e0[0x1f] = (RTCHitN)(char)(auVar52._28_4_ >> 0x18);
              local_29c0 = auVar53;
              local_29a0 = auVar54;
              auVar48 = vpcmpeqd_avx2(local_2980,local_2980);
              local_2ae0[1] = auVar48;
              *local_2ae0 = auVar48;
              local_2900 = pRVar4->instID[0];
              uStack_28fc = local_2900;
              uStack_28f8 = local_2900;
              uStack_28f4 = local_2900;
              uStack_28f0 = local_2900;
              uStack_28ec = local_2900;
              uStack_28e8 = local_2900;
              uStack_28e4 = local_2900;
              local_28e0 = pRVar4->instPrimID[0];
              uStack_28dc = local_28e0;
              uStack_28d8 = local_28e0;
              uStack_28d4 = local_28e0;
              uStack_28d0 = local_28e0;
              uStack_28cc = local_28e0;
              uStack_28c8 = local_28e0;
              uStack_28c4 = local_28e0;
              auVar47 = vblendmps_avx512vl(auVar46,auVar47);
              bVar43 = (bool)(bVar34 >> 1 & 1);
              bVar6 = (bool)(bVar34 >> 2 & 1);
              bVar7 = (bool)(bVar34 >> 3 & 1);
              bVar8 = (bool)(bVar34 >> 4 & 1);
              bVar9 = (bool)(bVar34 >> 5 & 1);
              bVar10 = (bool)(bVar34 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar34 & 1) * auVar47._0_4_ | !(bool)(bVar34 & 1) * local_28e0;
              *(uint *)(ray + 0x104) = (uint)bVar43 * auVar47._4_4_ | !bVar43 * local_28e0;
              *(uint *)(ray + 0x108) = (uint)bVar6 * auVar47._8_4_ | !bVar6 * local_28e0;
              *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar47._12_4_ | !bVar7 * local_28e0;
              *(uint *)(ray + 0x110) = (uint)bVar8 * auVar47._16_4_ | !bVar8 * local_28e0;
              *(uint *)(ray + 0x114) = (uint)bVar9 * auVar47._20_4_ | !bVar9 * local_28e0;
              *(uint *)(ray + 0x118) = (uint)bVar10 * auVar47._24_4_ | !bVar10 * local_28e0;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar34 >> 7) * auVar47._28_4_ | !(bool)(bVar34 >> 7) * local_28e0;
              local_2a80 = vpmovm2d_avx512vl((ulong)bVar34);
              local_2ad0.valid = (int *)local_2a80;
              local_2ad0.geometryUserPtr = pGVar3->userPtr;
              local_2ad0.context = context->user;
              local_2ad0.hit = local_29e0;
              local_2ad0.N = 8;
              local_2a00 = auVar46;
              uVar37 = uVar44;
              local_2ad0.ray = (RTCRayN *)ray;
              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar86 = ZEXT1664(auVar45);
                in_ZMM7 = ZEXT1664(local_2940._0_16_);
                in_ZMM9 = ZEXT1664(auVar85);
                local_2af0 = ray;
                (*pGVar3->occlusionFilterN)(&local_2ad0);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar101 = ZEXT3264(auVar46);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar102 = ZEXT3264(auVar46);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar108 = ZEXT3264(auVar46);
                uVar37 = uVar44 & 0xffffffff;
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar107 = ZEXT3264(auVar46);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                auVar106 = ZEXT3264(auVar46);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar105 = ZEXT3264(auVar46);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar104 = ZEXT3264(auVar46);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar103 = ZEXT3264(auVar46);
                ray = local_2af0;
              }
              uVar41 = vptestmd_avx512vl(local_2a80,local_2a80);
              if ((char)uVar41 != '\0') {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar86 = ZEXT1664(auVar86._0_16_);
                  in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                  (*p_Var5)(&local_2ad0);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar101 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar108 = ZEXT3264(auVar46);
                  uVar37 = uVar44 & 0xffffffff;
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar107 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar106 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar105 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar104 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar103 = ZEXT3264(auVar46);
                }
                uVar41 = vptestmd_avx512vl(local_2a80,local_2a80);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar43 = (bool)((byte)uVar41 & 1);
                auVar55._0_4_ =
                     (uint)bVar43 * auVar46._0_4_ | (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x100)
                ;
                bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
                auVar55._4_4_ =
                     (uint)bVar43 * auVar46._4_4_ | (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x104)
                ;
                bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
                auVar55._8_4_ =
                     (uint)bVar43 * auVar46._8_4_ | (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x108)
                ;
                bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
                auVar55._12_4_ =
                     (uint)bVar43 * auVar46._12_4_ |
                     (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x10c);
                bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
                auVar55._16_4_ =
                     (uint)bVar43 * auVar46._16_4_ |
                     (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x110);
                bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
                auVar55._20_4_ =
                     (uint)bVar43 * auVar46._20_4_ |
                     (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x114);
                bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
                auVar55._24_4_ =
                     (uint)bVar43 * auVar46._24_4_ |
                     (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x118);
                bVar43 = SUB81(uVar41 >> 7,0);
                auVar55._28_4_ =
                     (uint)bVar43 * auVar46._28_4_ |
                     (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x11c);
                *(undefined1 (*) [32])(local_2ad0.ray + 0x100) = auVar55;
              }
              bVar43 = (bool)((byte)uVar41 & 1);
              bVar6 = (bool)((byte)(uVar41 >> 1) & 1);
              bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
              bVar8 = (bool)((byte)(uVar41 >> 3) & 1);
              bVar9 = (bool)((byte)(uVar41 >> 4) & 1);
              bVar10 = (bool)((byte)(uVar41 >> 5) & 1);
              bVar11 = (bool)((byte)(uVar41 >> 6) & 1);
              bVar12 = SUB81(uVar41 >> 7,0);
              *(uint *)local_2ae8 =
                   (uint)bVar43 * *(int *)local_2ae8 | (uint)!bVar43 * local_2a00._0_4_;
              *(uint *)(local_2ae8 + 4) =
                   (uint)bVar6 * *(int *)(local_2ae8 + 4) | (uint)!bVar6 * local_2a00._4_4_;
              *(uint *)(local_2ae8 + 8) =
                   (uint)bVar7 * *(int *)(local_2ae8 + 8) | (uint)!bVar7 * local_2a00._8_4_;
              *(uint *)(local_2ae8 + 0xc) =
                   (uint)bVar8 * *(int *)(local_2ae8 + 0xc) | (uint)!bVar8 * local_2a00._12_4_;
              *(uint *)(local_2ae8 + 0x10) =
                   (uint)bVar9 * *(int *)(local_2ae8 + 0x10) | (uint)!bVar9 * local_2a00._16_4_;
              *(uint *)(local_2ae8 + 0x14) =
                   (uint)bVar10 * *(int *)(local_2ae8 + 0x14) | (uint)!bVar10 * local_2a00._20_4_;
              *(uint *)(local_2ae8 + 0x18) =
                   (uint)bVar11 * *(int *)(local_2ae8 + 0x18) | (uint)!bVar11 * local_2a00._24_4_;
              *(uint *)(local_2ae8 + 0x1c) =
                   (uint)bVar12 * *(int *)(local_2ae8 + 0x1c) | (uint)!bVar12 * local_2a00._28_4_;
              uVar44 = uVar37;
            }
            bVar36 = bVar36 & ~(byte)uVar41;
            lVar39 = local_2af8;
          }
        }
      }
      if (bVar36 == 0) {
        bVar43 = false;
      }
      else {
        auVar46 = *(undefined1 (*) [32])ray;
        auVar47 = *(undefined1 (*) [32])(ray + 0x20);
        auVar48 = *(undefined1 (*) [32])(ray + 0x40);
        auVar49 = *(undefined1 (*) [32])(ray + 0x80);
        in_ZMM7 = ZEXT3264(auVar49);
        auVar50 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar79 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar29._4_4_ = uStack_265c;
        auVar29._0_4_ = local_2660;
        auVar29._8_4_ = uStack_2658;
        auVar29._12_4_ = uStack_2654;
        auVar29._16_4_ = uStack_2650;
        auVar29._20_4_ = uStack_264c;
        auVar29._24_4_ = uStack_2648;
        auVar29._28_4_ = uStack_2644;
        auVar78 = vsubps_avx(auVar29,auVar46);
        auVar86 = ZEXT3264(auVar78);
        auVar28._4_4_ = uStack_267c;
        auVar28._0_4_ = local_2680;
        auVar28._8_4_ = uStack_2678;
        auVar28._12_4_ = uStack_2674;
        auVar28._16_4_ = uStack_2670;
        auVar28._20_4_ = uStack_266c;
        auVar28._24_4_ = uStack_2668;
        auVar28._28_4_ = uStack_2664;
        auVar81 = vsubps_avx(auVar28,auVar47);
        auVar60._4_4_ = uStack_269c;
        auVar60._0_4_ = local_26a0;
        auVar60._8_4_ = uStack_2698;
        auVar60._12_4_ = uStack_2694;
        auVar60._16_4_ = uStack_2690;
        auVar60._20_4_ = uStack_268c;
        auVar60._24_4_ = uStack_2688;
        auVar60._28_4_ = uStack_2684;
        auVar82 = vsubps_avx(auVar60,auVar48);
        in_ZMM9 = ZEXT3264(auVar82);
        auVar65 = vsubps_avx(local_26c0,auVar46);
        auVar64 = vsubps_avx(local_26e0,auVar47);
        auVar63 = vsubps_avx512vl(local_2700,auVar48);
        auVar46 = vsubps_avx512vl(local_2aa0,auVar46);
        auVar47 = vsubps_avx512vl(local_2a20,auVar47);
        auVar48 = vsubps_avx512vl(local_2640,auVar48);
        auVar61 = vsubps_avx512vl(auVar46,auVar78);
        auVar51 = vsubps_avx512vl(auVar47,auVar81);
        auVar52 = vsubps_avx512vl(auVar48,auVar82);
        auVar53 = vsubps_avx512vl(auVar78,auVar65);
        auVar54 = vsubps_avx512vl(auVar81,auVar64);
        auVar55 = vsubps_avx512vl(auVar82,auVar63);
        auVar60 = vsubps_avx512vl(auVar65,auVar46);
        auVar62 = vsubps_avx512vl(auVar64,auVar47);
        auVar66 = vsubps_avx512vl(auVar63,auVar48);
        auVar56 = vaddps_avx512vl(auVar46,auVar78);
        auVar58 = vaddps_avx512vl(auVar47,auVar81);
        auVar57 = vaddps_avx512vl(auVar48,auVar82);
        auVar59 = vmulps_avx512vl(auVar58,auVar52);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar51,auVar57);
        auVar57 = vmulps_avx512vl(auVar57,auVar61);
        auVar67 = vfmsub231ps_avx512vl(auVar57,auVar52,auVar56);
        auVar57._4_4_ = auVar51._4_4_ * auVar56._4_4_;
        auVar57._0_4_ = auVar51._0_4_ * auVar56._0_4_;
        auVar57._8_4_ = auVar51._8_4_ * auVar56._8_4_;
        auVar57._12_4_ = auVar51._12_4_ * auVar56._12_4_;
        auVar57._16_4_ = auVar51._16_4_ * auVar56._16_4_;
        auVar57._20_4_ = auVar51._20_4_ * auVar56._20_4_;
        auVar57._24_4_ = auVar51._24_4_ * auVar56._24_4_;
        auVar57._28_4_ = auVar56._28_4_;
        auVar80 = vfmsub231ps_fma(auVar57,auVar61,auVar58);
        fVar92 = auVar79._0_4_;
        auVar83._0_4_ = fVar92 * auVar80._0_4_;
        fVar94 = auVar79._4_4_;
        auVar83._4_4_ = fVar94 * auVar80._4_4_;
        fVar95 = auVar79._8_4_;
        auVar83._8_4_ = fVar95 * auVar80._8_4_;
        fVar96 = auVar79._12_4_;
        auVar83._12_4_ = fVar96 * auVar80._12_4_;
        fVar97 = auVar79._16_4_;
        auVar83._16_4_ = fVar97 * 0.0;
        fVar98 = auVar79._20_4_;
        auVar83._20_4_ = fVar98 * 0.0;
        fVar99 = auVar79._24_4_;
        auVar83._24_4_ = fVar99 * 0.0;
        auVar83._28_4_ = 0;
        auVar56 = vfmadd231ps_avx512vl(auVar83,auVar50,auVar67);
        auVar57 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar59);
        auVar84._0_4_ = auVar65._0_4_ + auVar78._0_4_;
        auVar84._4_4_ = auVar65._4_4_ + auVar78._4_4_;
        auVar84._8_4_ = auVar65._8_4_ + auVar78._8_4_;
        auVar84._12_4_ = auVar65._12_4_ + auVar78._12_4_;
        auVar84._16_4_ = auVar65._16_4_ + auVar78._16_4_;
        auVar84._20_4_ = auVar65._20_4_ + auVar78._20_4_;
        auVar84._24_4_ = auVar65._24_4_ + auVar78._24_4_;
        auVar84._28_4_ = auVar65._28_4_ + auVar78._28_4_;
        auVar56 = vaddps_avx512vl(auVar81,auVar64);
        auVar58 = vaddps_avx512vl(auVar82,auVar63);
        auVar59 = vmulps_avx512vl(auVar56,auVar55);
        auVar59 = vfmsub231ps_avx512vl(auVar59,auVar54,auVar58);
        auVar58 = vmulps_avx512vl(auVar58,auVar53);
        auVar67 = vfmsub231ps_avx512vl(auVar58,auVar55,auVar84);
        auVar58 = vmulps_avx512vl(auVar84,auVar54);
        auVar56 = vfmsub231ps_avx512vl(auVar58,auVar53,auVar56);
        auVar58._4_4_ = fVar94 * auVar56._4_4_;
        auVar58._0_4_ = fVar92 * auVar56._0_4_;
        auVar58._8_4_ = fVar95 * auVar56._8_4_;
        auVar58._12_4_ = fVar96 * auVar56._12_4_;
        auVar58._16_4_ = fVar97 * auVar56._16_4_;
        auVar58._20_4_ = fVar98 * auVar56._20_4_;
        auVar58._24_4_ = fVar99 * auVar56._24_4_;
        auVar58._28_4_ = auVar56._28_4_;
        auVar56 = vfmadd231ps_avx512vl(auVar58,auVar50,auVar67);
        auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar101 = ZEXT3264(auVar58);
        auVar67 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar59);
        auVar46 = vaddps_avx512vl(auVar65,auVar46);
        auVar47 = vaddps_avx512vl(auVar64,auVar47);
        auVar48 = vaddps_avx512vl(auVar63,auVar48);
        auVar65 = vmulps_avx512vl(auVar47,auVar66);
        auVar65 = vfmsub231ps_avx512vl(auVar65,auVar62,auVar48);
        auVar48 = vmulps_avx512vl(auVar48,auVar60);
        auVar48 = vfmsub231ps_avx512vl(auVar48,auVar66,auVar46);
        auVar59._4_4_ = auVar46._4_4_ * auVar62._4_4_;
        auVar59._0_4_ = auVar46._0_4_ * auVar62._0_4_;
        auVar59._8_4_ = auVar46._8_4_ * auVar62._8_4_;
        auVar59._12_4_ = auVar46._12_4_ * auVar62._12_4_;
        auVar59._16_4_ = auVar46._16_4_ * auVar62._16_4_;
        auVar59._20_4_ = auVar46._20_4_ * auVar62._20_4_;
        auVar59._24_4_ = auVar46._24_4_ * auVar62._24_4_;
        auVar59._28_4_ = auVar46._28_4_;
        auVar80 = vfmsub231ps_fma(auVar59,auVar60,auVar47);
        auVar46 = vmulps_avx512vl(ZEXT1632(auVar80),auVar79);
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar50,auVar48);
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar49,auVar65);
        auVar100._0_4_ = auVar57._0_4_ + auVar67._0_4_;
        auVar100._4_4_ = auVar57._4_4_ + auVar67._4_4_;
        auVar100._8_4_ = auVar57._8_4_ + auVar67._8_4_;
        auVar100._12_4_ = auVar57._12_4_ + auVar67._12_4_;
        auVar100._16_4_ = auVar57._16_4_ + auVar67._16_4_;
        auVar100._20_4_ = auVar57._20_4_ + auVar67._20_4_;
        auVar100._24_4_ = auVar57._24_4_ + auVar67._24_4_;
        auVar100._28_4_ = auVar57._28_4_ + auVar67._28_4_;
        auVar47 = vaddps_avx512vl(auVar46,auVar100);
        auVar63 = auVar103._0_32_;
        vandps_avx512vl(auVar47,auVar63);
        auVar56._8_4_ = 0x34000000;
        auVar56._0_8_ = 0x3400000034000000;
        auVar56._12_4_ = 0x34000000;
        auVar56._16_4_ = 0x34000000;
        auVar56._20_4_ = 0x34000000;
        auVar56._24_4_ = 0x34000000;
        auVar56._28_4_ = 0x34000000;
        auVar48 = vmulps_avx512vl(auVar47,auVar56);
        auVar65 = vminps_avx512vl(auVar57,auVar67);
        auVar65 = vminps_avx512vl(auVar65,auVar46);
        auVar64 = vxorps_avx512vl(auVar48,auVar58);
        uVar14 = vcmpps_avx512vl(auVar65,auVar64,5);
        auVar65 = vmaxps_avx512vl(auVar57,auVar67);
        auVar46 = vmaxps_avx512vl(auVar65,auVar46);
        uVar15 = vcmpps_avx512vl(auVar46,auVar48,2);
        bVar34 = ((byte)uVar14 | (byte)uVar15) & bVar36;
        if (bVar34 == 0) {
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar102 = ZEXT3264(auVar46);
        }
        else {
          auVar46 = vmulps_avx512vl(auVar54,auVar52);
          auVar48 = vmulps_avx512vl(auVar61,auVar55);
          auVar65 = vmulps_avx512vl(auVar53,auVar51);
          auVar64 = vmulps_avx512vl(auVar62,auVar55);
          auVar56 = vmulps_avx512vl(auVar53,auVar66);
          auVar58 = vmulps_avx512vl(auVar60,auVar54);
          auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar46);
          auVar52 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar48);
          auVar61 = vfmsub213ps_avx512vl(auVar61,auVar54,auVar65);
          auVar54 = vfmsub213ps_avx512vl(auVar66,auVar54,auVar64);
          auVar55 = vfmsub213ps_avx512vl(auVar60,auVar55,auVar56);
          auVar53 = vfmsub213ps_avx512vl(auVar62,auVar53,auVar58);
          vandps_avx512vl(auVar46,auVar63);
          vandps_avx512vl(auVar64,auVar63);
          uVar41 = vcmpps_avx512vl(auVar53,auVar53,1);
          vandps_avx512vl(auVar48,auVar63);
          vandps_avx512vl(auVar56,auVar63);
          uVar37 = vcmpps_avx512vl(auVar53,auVar53,1);
          vandps_avx512vl(auVar65,auVar63);
          vandps_avx512vl(auVar58,auVar63);
          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar101 = ZEXT3264(auVar46);
          uVar2 = vcmpps_avx512vl(auVar53,auVar53,1);
          bVar43 = (bool)((byte)uVar41 & 1);
          auVar68._0_4_ = (uint)bVar43 * auVar51._0_4_ | (uint)!bVar43 * auVar54._0_4_;
          bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar68._4_4_ = (uint)bVar43 * auVar51._4_4_ | (uint)!bVar43 * auVar54._4_4_;
          bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar68._8_4_ = (uint)bVar43 * auVar51._8_4_ | (uint)!bVar43 * auVar54._8_4_;
          bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar68._12_4_ = (uint)bVar43 * auVar51._12_4_ | (uint)!bVar43 * auVar54._12_4_;
          bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar68._16_4_ = (uint)bVar43 * auVar51._16_4_ | (uint)!bVar43 * auVar54._16_4_;
          bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar68._20_4_ = (uint)bVar43 * auVar51._20_4_ | (uint)!bVar43 * auVar54._20_4_;
          bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar68._24_4_ = (uint)bVar43 * auVar51._24_4_ | (uint)!bVar43 * auVar54._24_4_;
          bVar43 = SUB81(uVar41 >> 7,0);
          auVar68._28_4_ = (uint)bVar43 * auVar51._28_4_ | (uint)!bVar43 * auVar54._28_4_;
          bVar43 = (bool)((byte)uVar37 & 1);
          auVar69._0_4_ = (uint)bVar43 * auVar52._0_4_ | (uint)!bVar43 * auVar55._0_4_;
          bVar43 = (bool)((byte)(uVar37 >> 1) & 1);
          auVar69._4_4_ = (uint)bVar43 * auVar52._4_4_ | (uint)!bVar43 * auVar55._4_4_;
          bVar43 = (bool)((byte)(uVar37 >> 2) & 1);
          auVar69._8_4_ = (uint)bVar43 * auVar52._8_4_ | (uint)!bVar43 * auVar55._8_4_;
          bVar43 = (bool)((byte)(uVar37 >> 3) & 1);
          auVar69._12_4_ = (uint)bVar43 * auVar52._12_4_ | (uint)!bVar43 * auVar55._12_4_;
          bVar43 = (bool)((byte)(uVar37 >> 4) & 1);
          auVar69._16_4_ = (uint)bVar43 * auVar52._16_4_ | (uint)!bVar43 * auVar55._16_4_;
          bVar43 = (bool)((byte)(uVar37 >> 5) & 1);
          auVar69._20_4_ = (uint)bVar43 * auVar52._20_4_ | (uint)!bVar43 * auVar55._20_4_;
          bVar43 = (bool)((byte)(uVar37 >> 6) & 1);
          auVar69._24_4_ = (uint)bVar43 * auVar52._24_4_ | (uint)!bVar43 * auVar55._24_4_;
          bVar43 = SUB81(uVar37 >> 7,0);
          auVar69._28_4_ = (uint)bVar43 * auVar52._28_4_ | (uint)!bVar43 * auVar55._28_4_;
          bVar43 = (bool)((byte)uVar2 & 1);
          auVar70._0_4_ = (float)((uint)bVar43 * auVar61._0_4_ | (uint)!bVar43 * auVar53._0_4_);
          bVar43 = (bool)((byte)(uVar2 >> 1) & 1);
          auVar70._4_4_ = (float)((uint)bVar43 * auVar61._4_4_ | (uint)!bVar43 * auVar53._4_4_);
          bVar43 = (bool)((byte)(uVar2 >> 2) & 1);
          auVar70._8_4_ = (float)((uint)bVar43 * auVar61._8_4_ | (uint)!bVar43 * auVar53._8_4_);
          bVar43 = (bool)((byte)(uVar2 >> 3) & 1);
          auVar70._12_4_ = (float)((uint)bVar43 * auVar61._12_4_ | (uint)!bVar43 * auVar53._12_4_);
          bVar43 = (bool)((byte)(uVar2 >> 4) & 1);
          auVar70._16_4_ = (float)((uint)bVar43 * auVar61._16_4_ | (uint)!bVar43 * auVar53._16_4_);
          bVar43 = (bool)((byte)(uVar2 >> 5) & 1);
          auVar70._20_4_ = (float)((uint)bVar43 * auVar61._20_4_ | (uint)!bVar43 * auVar53._20_4_);
          bVar43 = (bool)((byte)(uVar2 >> 6) & 1);
          auVar70._24_4_ = (float)((uint)bVar43 * auVar61._24_4_ | (uint)!bVar43 * auVar53._24_4_);
          bVar43 = SUB81(uVar2 >> 7,0);
          auVar70._28_4_ = (uint)bVar43 * auVar61._28_4_ | (uint)!bVar43 * auVar53._28_4_;
          auVar22._4_4_ = fVar94 * auVar70._4_4_;
          auVar22._0_4_ = fVar92 * auVar70._0_4_;
          auVar22._8_4_ = fVar95 * auVar70._8_4_;
          auVar22._12_4_ = fVar96 * auVar70._12_4_;
          auVar22._16_4_ = fVar97 * auVar70._16_4_;
          auVar22._20_4_ = fVar98 * auVar70._20_4_;
          auVar22._24_4_ = fVar99 * auVar70._24_4_;
          auVar22._28_4_ = auVar79._28_4_;
          auVar80 = vfmadd213ps_fma(auVar50,auVar69,auVar22);
          auVar80 = vfmadd213ps_fma(auVar49,auVar68,ZEXT1632(auVar80));
          auVar50 = ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                       CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                CONCAT44(auVar80._4_4_ + auVar80._4_4_,
                                                         auVar80._0_4_ + auVar80._0_4_))));
          in_ZMM7 = ZEXT3264(auVar50);
          auVar90._0_4_ = auVar82._0_4_ * auVar70._0_4_;
          auVar90._4_4_ = auVar82._4_4_ * auVar70._4_4_;
          auVar90._8_4_ = auVar82._8_4_ * auVar70._8_4_;
          auVar90._12_4_ = auVar82._12_4_ * auVar70._12_4_;
          auVar90._16_4_ = auVar82._16_4_ * auVar70._16_4_;
          auVar90._20_4_ = auVar82._20_4_ * auVar70._20_4_;
          auVar90._24_4_ = auVar82._24_4_ * auVar70._24_4_;
          auVar90._28_4_ = 0;
          auVar80 = vfmadd213ps_fma(auVar81,auVar69,auVar90);
          auVar18 = vfmadd213ps_fma(auVar78,auVar68,ZEXT1632(auVar80));
          auVar48 = vrcp14ps_avx512vl(auVar50);
          auVar49 = vxorps_avx512vl(auVar50,auVar46);
          auVar79 = auVar105._0_32_;
          auVar46 = vfnmadd213ps_avx512vl(auVar48,auVar50,auVar79);
          auVar80 = vfmadd132ps_fma(auVar46,auVar48,auVar48);
          in_ZMM9 = ZEXT1664(auVar80);
          auVar46 = *(undefined1 (*) [32])(ray + 0x100);
          auVar85._0_4_ = auVar80._0_4_ * (auVar18._0_4_ + auVar18._0_4_);
          auVar85._4_4_ = auVar80._4_4_ * (auVar18._4_4_ + auVar18._4_4_);
          auVar85._8_4_ = auVar80._8_4_ * (auVar18._8_4_ + auVar18._8_4_);
          auVar85._12_4_ = auVar80._12_4_ * (auVar18._12_4_ + auVar18._12_4_);
          auVar48 = ZEXT1632(auVar85);
          auVar86 = ZEXT3264(auVar48);
          uVar14 = vcmpps_avx512vl(auVar48,auVar46,2);
          uVar15 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(ray + 0x60),0xd);
          uVar16 = vcmpps_avx512vl(auVar50,auVar49,4);
          bVar34 = bVar34 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
          auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar102 = ZEXT3264(auVar49);
          if (bVar34 != 0) {
            pGVar3 = (context->scene->geometries).items[*(uint *)(lVar39 + uVar40 * 4)].ptr;
            local_2aa0._0_8_ = pGVar3;
            uVar1 = pGVar3->mask;
            auVar88._4_4_ = uVar1;
            auVar88._0_4_ = uVar1;
            auVar88._8_4_ = uVar1;
            auVar88._12_4_ = uVar1;
            auVar88._16_4_ = uVar1;
            auVar88._20_4_ = uVar1;
            auVar88._24_4_ = uVar1;
            auVar88._28_4_ = uVar1;
            uVar14 = vptestmd_avx512vl(auVar88,*(undefined1 (*) [32])(ray + 0x120));
            bVar34 = bVar34 & (byte)uVar14;
            uVar41 = (ulong)bVar34;
            if (bVar34 != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                uVar37 = vcmpps_avx512vl(auVar47,auVar104._0_32_,5);
                auVar49 = vrcp14ps_avx512vl(auVar47);
                auVar47 = vfnmadd213ps_avx512vl(auVar47,auVar49,auVar79);
                auVar47 = vfmadd132ps_avx512vl(auVar47,auVar49,auVar49);
                fVar96 = (float)((uint)((byte)uVar37 & 1) * auVar47._0_4_);
                fVar95 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar47._4_4_);
                fVar94 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar47._8_4_);
                fVar92 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar47._12_4_);
                fVar97 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar47._16_4_);
                fVar98 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar47._20_4_);
                fVar99 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar47._24_4_);
                auVar23._4_4_ = fVar95 * auVar57._4_4_;
                auVar23._0_4_ = fVar96 * auVar57._0_4_;
                auVar23._8_4_ = fVar94 * auVar57._8_4_;
                auVar23._12_4_ = fVar92 * auVar57._12_4_;
                auVar23._16_4_ = fVar97 * auVar57._16_4_;
                auVar23._20_4_ = fVar98 * auVar57._20_4_;
                auVar23._24_4_ = fVar99 * auVar57._24_4_;
                auVar23._28_4_ = auVar57._28_4_;
                auVar47 = vminps_avx512vl(auVar23,auVar79);
                auVar24._4_4_ = fVar95 * auVar67._4_4_;
                auVar24._0_4_ = fVar96 * auVar67._0_4_;
                auVar24._8_4_ = fVar94 * auVar67._8_4_;
                auVar24._12_4_ = fVar92 * auVar67._12_4_;
                auVar24._16_4_ = fVar97 * auVar67._16_4_;
                auVar24._20_4_ = fVar98 * auVar67._20_4_;
                auVar24._24_4_ = fVar99 * auVar67._24_4_;
                auVar24._28_4_ = auVar67._28_4_;
                auVar49 = vminps_avx512vl(auVar24,auVar79);
                local_2980 = vsubps_avx512vl(auVar79,auVar47);
                local_2960 = vsubps_avx512vl(auVar79,auVar49);
                pRVar4 = context->user;
                local_2920 = vpbroadcastd_avx512vl();
                local_2940 = vpbroadcastd_avx512vl();
                in_ZMM7 = ZEXT3264(local_2940);
                local_29e0[0] = (RTCHitN)(char)auVar68._0_4_;
                local_29e0[1] = (RTCHitN)(char)(auVar68._0_4_ >> 8);
                local_29e0[2] = (RTCHitN)(char)(auVar68._0_4_ >> 0x10);
                local_29e0[3] = (RTCHitN)(char)(auVar68._0_4_ >> 0x18);
                local_29e0[4] = (RTCHitN)(char)auVar68._4_4_;
                local_29e0[5] = (RTCHitN)(char)(auVar68._4_4_ >> 8);
                local_29e0[6] = (RTCHitN)(char)(auVar68._4_4_ >> 0x10);
                local_29e0[7] = (RTCHitN)(char)(auVar68._4_4_ >> 0x18);
                local_29e0[8] = (RTCHitN)(char)auVar68._8_4_;
                local_29e0[9] = (RTCHitN)(char)(auVar68._8_4_ >> 8);
                local_29e0[10] = (RTCHitN)(char)(auVar68._8_4_ >> 0x10);
                local_29e0[0xb] = (RTCHitN)(char)(auVar68._8_4_ >> 0x18);
                local_29e0[0xc] = (RTCHitN)(char)auVar68._12_4_;
                local_29e0[0xd] = (RTCHitN)(char)(auVar68._12_4_ >> 8);
                local_29e0[0xe] = (RTCHitN)(char)(auVar68._12_4_ >> 0x10);
                local_29e0[0xf] = (RTCHitN)(char)(auVar68._12_4_ >> 0x18);
                local_29e0[0x10] = (RTCHitN)(char)auVar68._16_4_;
                local_29e0[0x11] = (RTCHitN)(char)(auVar68._16_4_ >> 8);
                local_29e0[0x12] = (RTCHitN)(char)(auVar68._16_4_ >> 0x10);
                local_29e0[0x13] = (RTCHitN)(char)(auVar68._16_4_ >> 0x18);
                local_29e0[0x14] = (RTCHitN)(char)auVar68._20_4_;
                local_29e0[0x15] = (RTCHitN)(char)(auVar68._20_4_ >> 8);
                local_29e0[0x16] = (RTCHitN)(char)(auVar68._20_4_ >> 0x10);
                local_29e0[0x17] = (RTCHitN)(char)(auVar68._20_4_ >> 0x18);
                local_29e0[0x18] = (RTCHitN)(char)auVar68._24_4_;
                local_29e0[0x19] = (RTCHitN)(char)(auVar68._24_4_ >> 8);
                local_29e0[0x1a] = (RTCHitN)(char)(auVar68._24_4_ >> 0x10);
                local_29e0[0x1b] = (RTCHitN)(char)(auVar68._24_4_ >> 0x18);
                local_29e0[0x1c] = (RTCHitN)(char)auVar68._28_4_;
                local_29e0[0x1d] = (RTCHitN)(char)(auVar68._28_4_ >> 8);
                local_29e0[0x1e] = (RTCHitN)(char)(auVar68._28_4_ >> 0x10);
                local_29e0[0x1f] = (RTCHitN)(char)(auVar68._28_4_ >> 0x18);
                local_29c0 = auVar69;
                local_29a0 = auVar70;
                auVar47 = vpcmpeqd_avx2(auVar69,auVar69);
                local_2ae0[1] = auVar47;
                *local_2ae0 = auVar47;
                local_2900 = pRVar4->instID[0];
                uStack_28fc = local_2900;
                uStack_28f8 = local_2900;
                uStack_28f4 = local_2900;
                uStack_28f0 = local_2900;
                uStack_28ec = local_2900;
                uStack_28e8 = local_2900;
                uStack_28e4 = local_2900;
                local_28e0 = pRVar4->instPrimID[0];
                uStack_28dc = local_28e0;
                uStack_28d8 = local_28e0;
                uStack_28d4 = local_28e0;
                uStack_28d0 = local_28e0;
                uStack_28cc = local_28e0;
                uStack_28c8 = local_28e0;
                uStack_28c4 = local_28e0;
                auVar47 = vblendmps_avx512vl(auVar46,auVar48);
                bVar43 = (bool)(bVar34 >> 1 & 1);
                bVar6 = (bool)(bVar34 >> 2 & 1);
                bVar7 = (bool)(bVar34 >> 3 & 1);
                bVar8 = (bool)(bVar34 >> 4 & 1);
                bVar9 = (bool)(bVar34 >> 5 & 1);
                bVar10 = (bool)(bVar34 >> 6 & 1);
                *(uint *)(ray + 0x100) =
                     (uint)(bVar34 & 1) * auVar47._0_4_ | !(bool)(bVar34 & 1) * local_28e0;
                *(uint *)(ray + 0x104) = (uint)bVar43 * auVar47._4_4_ | !bVar43 * local_28e0;
                *(uint *)(ray + 0x108) = (uint)bVar6 * auVar47._8_4_ | !bVar6 * local_28e0;
                *(uint *)(ray + 0x10c) = (uint)bVar7 * auVar47._12_4_ | !bVar7 * local_28e0;
                *(uint *)(ray + 0x110) = (uint)bVar8 * auVar47._16_4_ | !bVar8 * local_28e0;
                *(uint *)(ray + 0x114) = (uint)bVar9 * auVar47._20_4_ | !bVar9 * local_28e0;
                *(uint *)(ray + 0x118) = (uint)bVar10 * auVar47._24_4_ | !bVar10 * local_28e0;
                *(uint *)(ray + 0x11c) =
                     (uint)(bVar34 >> 7) * auVar47._28_4_ | !(bool)(bVar34 >> 7) * local_28e0;
                local_2a80 = vpmovm2d_avx512vl(uVar41);
                local_2ad0.valid = (int *)local_2a80;
                local_2ad0.geometryUserPtr = pGVar3->userPtr;
                local_2ad0.context = context->user;
                local_2ad0.hit = local_29e0;
                local_2ad0.N = 8;
                local_2a20 = auVar46;
                uVar37 = uVar44;
                local_2ad0.ray = (RTCRayN *)ray;
                if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar86 = ZEXT1664(auVar85);
                  in_ZMM7 = ZEXT1664(local_2940._0_16_);
                  in_ZMM9 = ZEXT1664(auVar80);
                  (*pGVar3->occlusionFilterN)(&local_2ad0);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar101 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar108 = ZEXT3264(auVar46);
                  uVar37 = uVar44 & 0xffffffff;
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar107 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  auVar106 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar105 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                  auVar104 = ZEXT3264(auVar46);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar103 = ZEXT3264(auVar46);
                  lVar39 = local_2af8;
                }
                uVar41 = vptestmd_avx512vl(local_2a80,local_2a80);
                if ((char)uVar41 != '\0') {
                  p_Var5 = context->args->filter;
                  if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_2aa0._0_8_ + 0x3e) & 0x40) != 0)))) {
                    auVar86 = ZEXT1664(auVar86._0_16_);
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    (*p_Var5)(&local_2ad0);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar101 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar102 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar108 = ZEXT3264(auVar46);
                    uVar37 = uVar44 & 0xffffffff;
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar107 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar106 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar105 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar104 = ZEXT3264(auVar46);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar103 = ZEXT3264(auVar46);
                    lVar39 = local_2af8;
                  }
                  uVar41 = vptestmd_avx512vl(local_2a80,local_2a80);
                  auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar43 = (bool)((byte)uVar41 & 1);
                  auVar71._0_4_ =
                       (uint)bVar43 * auVar46._0_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x100);
                  bVar43 = (bool)((byte)(uVar41 >> 1) & 1);
                  auVar71._4_4_ =
                       (uint)bVar43 * auVar46._4_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x104);
                  bVar43 = (bool)((byte)(uVar41 >> 2) & 1);
                  auVar71._8_4_ =
                       (uint)bVar43 * auVar46._8_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x108);
                  bVar43 = (bool)((byte)(uVar41 >> 3) & 1);
                  auVar71._12_4_ =
                       (uint)bVar43 * auVar46._12_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x10c);
                  bVar43 = (bool)((byte)(uVar41 >> 4) & 1);
                  auVar71._16_4_ =
                       (uint)bVar43 * auVar46._16_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x110);
                  bVar43 = (bool)((byte)(uVar41 >> 5) & 1);
                  auVar71._20_4_ =
                       (uint)bVar43 * auVar46._20_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x114);
                  bVar43 = (bool)((byte)(uVar41 >> 6) & 1);
                  auVar71._24_4_ =
                       (uint)bVar43 * auVar46._24_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x118);
                  bVar43 = SUB81(uVar41 >> 7,0);
                  auVar71._28_4_ =
                       (uint)bVar43 * auVar46._28_4_ |
                       (uint)!bVar43 * *(int *)(local_2ad0.ray + 0x11c);
                  *(undefined1 (*) [32])(local_2ad0.ray + 0x100) = auVar71;
                }
                bVar43 = (bool)((byte)uVar41 & 1);
                bVar6 = (bool)((byte)(uVar41 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar41 >> 3) & 1);
                bVar9 = (bool)((byte)(uVar41 >> 4) & 1);
                bVar10 = (bool)((byte)(uVar41 >> 5) & 1);
                bVar11 = (bool)((byte)(uVar41 >> 6) & 1);
                bVar12 = SUB81(uVar41 >> 7,0);
                *(uint *)local_2ae8 =
                     (uint)bVar43 * *(int *)local_2ae8 | (uint)!bVar43 * local_2a20._0_4_;
                *(uint *)(local_2ae8 + 4) =
                     (uint)bVar6 * *(int *)(local_2ae8 + 4) | (uint)!bVar6 * local_2a20._4_4_;
                *(uint *)(local_2ae8 + 8) =
                     (uint)bVar7 * *(int *)(local_2ae8 + 8) | (uint)!bVar7 * local_2a20._8_4_;
                *(uint *)(local_2ae8 + 0xc) =
                     (uint)bVar8 * *(int *)(local_2ae8 + 0xc) | (uint)!bVar8 * local_2a20._12_4_;
                *(uint *)(local_2ae8 + 0x10) =
                     (uint)bVar9 * *(int *)(local_2ae8 + 0x10) | (uint)!bVar9 * local_2a20._16_4_;
                *(uint *)(local_2ae8 + 0x14) =
                     (uint)bVar10 * *(int *)(local_2ae8 + 0x14) | (uint)!bVar10 * local_2a20._20_4_;
                *(uint *)(local_2ae8 + 0x18) =
                     (uint)bVar11 * *(int *)(local_2ae8 + 0x18) | (uint)!bVar11 * local_2a20._24_4_;
                *(uint *)(local_2ae8 + 0x1c) =
                     (uint)bVar12 * *(int *)(local_2ae8 + 0x1c) | (uint)!bVar12 * local_2a20._28_4_;
                uVar44 = uVar37;
              }
              bVar36 = bVar36 & ~(byte)uVar41;
            }
          }
        }
        bVar43 = bVar36 != 0;
      }
      if ((!bVar43) || (bVar43 = 2 < uVar40, uVar40 = uVar40 + 1, bVar43)) break;
    }
    bVar31 = bVar31 & bVar36;
    if (bVar31 == 0) break;
  }
  bVar31 = ~bVar31;
LAB_007ac743:
  bVar32 = bVar32 | bVar31;
  uVar41 = local_2ad8;
  if (bVar32 == 0xff) {
LAB_007ac771:
    iVar33 = 3;
  }
  else {
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    local_2720._0_4_ =
         (uint)(bVar32 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar32 & 1) * local_2720._0_4_;
    bVar43 = (bool)(bVar32 >> 1 & 1);
    local_2720._4_4_ = (uint)bVar43 * auVar46._4_4_ | (uint)!bVar43 * local_2720._4_4_;
    bVar43 = (bool)(bVar32 >> 2 & 1);
    local_2720._8_4_ = (uint)bVar43 * auVar46._8_4_ | (uint)!bVar43 * local_2720._8_4_;
    bVar43 = (bool)(bVar32 >> 3 & 1);
    local_2720._12_4_ = (uint)bVar43 * auVar46._12_4_ | (uint)!bVar43 * local_2720._12_4_;
    bVar43 = (bool)(bVar32 >> 4 & 1);
    local_2720._16_4_ = (uint)bVar43 * auVar46._16_4_ | (uint)!bVar43 * local_2720._16_4_;
    bVar43 = (bool)(bVar32 >> 5 & 1);
    local_2720._20_4_ = (uint)bVar43 * auVar46._20_4_ | (uint)!bVar43 * local_2720._20_4_;
    bVar43 = (bool)(bVar32 >> 6 & 1);
    local_2720._24_4_ = (uint)bVar43 * auVar46._24_4_ | (uint)!bVar43 * local_2720._24_4_;
    local_2720._28_4_ =
         (uint)(bVar32 >> 7) * auVar46._28_4_ | (uint)!(bool)(bVar32 >> 7) * local_2720._28_4_;
    iVar33 = 0;
  }
LAB_007ac774:
  if (iVar33 == 3) {
    bVar32 = bVar32 & (byte)uVar44;
    bVar43 = (bool)(bVar32 >> 1 & 1);
    bVar6 = (bool)(bVar32 >> 2 & 1);
    bVar7 = (bool)(bVar32 >> 3 & 1);
    bVar8 = (bool)(bVar32 >> 4 & 1);
    bVar9 = (bool)(bVar32 >> 5 & 1);
    bVar10 = (bool)(bVar32 >> 6 & 1);
    *(uint *)local_2ae8 =
         (uint)(bVar32 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar32 & 1) * *(int *)local_2ae8;
    *(uint *)(local_2ae8 + 4) =
         (uint)bVar43 * auVar106._4_4_ | (uint)!bVar43 * *(int *)(local_2ae8 + 4);
    *(uint *)(local_2ae8 + 8) =
         (uint)bVar6 * auVar106._8_4_ | (uint)!bVar6 * *(int *)(local_2ae8 + 8);
    *(uint *)(local_2ae8 + 0xc) =
         (uint)bVar7 * auVar106._12_4_ | (uint)!bVar7 * *(int *)(local_2ae8 + 0xc);
    *(uint *)(local_2ae8 + 0x10) =
         (uint)bVar8 * auVar106._16_4_ | (uint)!bVar8 * *(int *)(local_2ae8 + 0x10);
    *(uint *)(local_2ae8 + 0x14) =
         (uint)bVar9 * auVar106._20_4_ | (uint)!bVar9 * *(int *)(local_2ae8 + 0x14);
    *(uint *)(local_2ae8 + 0x18) =
         (uint)bVar10 * auVar106._24_4_ | (uint)!bVar10 * *(int *)(local_2ae8 + 0x18);
    *(uint *)(local_2ae8 + 0x1c) =
         (uint)(bVar32 >> 7) * auVar106._28_4_ |
         (uint)!(bool)(bVar32 >> 7) * *(int *)(local_2ae8 + 0x1c);
    return;
  }
  goto LAB_007ab72c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }